

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O3

void idct64_low16_ssse3(__m128i *input,__m128i *output)

{
  int8_t in_R8B;
  undefined4 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  __m128i alVar416;
  undefined1 auVar417 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar436 [16];
  undefined2 local_848;
  undefined2 uStack_846;
  undefined2 uStack_844;
  undefined2 uStack_842;
  undefined2 uStack_840;
  undefined2 uStack_83e;
  undefined2 uStack_83c;
  undefined2 uStack_83a;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined2 local_808;
  undefined2 uStack_806;
  undefined2 uStack_804;
  undefined2 uStack_802;
  undefined2 uStack_800;
  undefined2 uStack_7fe;
  undefined2 uStack_7fc;
  undefined2 uStack_7fa;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined2 local_7a8;
  undefined2 uStack_7a6;
  undefined2 uStack_7a4;
  undefined2 uStack_7a2;
  undefined2 uStack_7a0;
  undefined2 uStack_79e;
  undefined2 uStack_79c;
  undefined2 uStack_79a;
  undefined2 local_798;
  undefined2 uStack_796;
  undefined2 uStack_794;
  undefined2 uStack_792;
  undefined2 uStack_790;
  undefined2 uStack_78e;
  undefined2 uStack_78c;
  undefined2 uStack_78a;
  undefined2 local_788;
  undefined2 uStack_786;
  undefined2 uStack_784;
  undefined2 uStack_782;
  undefined2 uStack_780;
  undefined2 uStack_77e;
  undefined2 uStack_77c;
  undefined2 uStack_77a;
  undefined2 local_768;
  undefined2 uStack_766;
  undefined2 uStack_764;
  undefined2 uStack_762;
  undefined2 uStack_760;
  undefined2 uStack_75e;
  undefined2 uStack_75c;
  undefined2 uStack_75a;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined2 local_708;
  undefined2 uStack_706;
  undefined2 uStack_704;
  undefined2 uStack_702;
  undefined2 uStack_700;
  undefined2 uStack_6fe;
  undefined2 uStack_6fc;
  undefined2 uStack_6fa;
  undefined2 local_6f8;
  undefined2 uStack_6f6;
  undefined2 uStack_6f4;
  undefined2 uStack_6f2;
  undefined2 uStack_6f0;
  undefined2 uStack_6ee;
  undefined2 uStack_6ec;
  undefined2 uStack_6ea;
  undefined2 local_6e8;
  undefined2 uStack_6e6;
  undefined2 uStack_6e4;
  undefined2 uStack_6e2;
  undefined2 uStack_6e0;
  undefined2 uStack_6de;
  undefined2 uStack_6dc;
  undefined2 uStack_6da;
  undefined2 local_6d8;
  undefined2 uStack_6d6;
  undefined2 uStack_6d4;
  undefined2 uStack_6d2;
  undefined2 uStack_6d0;
  undefined2 uStack_6ce;
  undefined2 uStack_6cc;
  undefined2 uStack_6ca;
  undefined2 local_6b8;
  undefined2 uStack_6b6;
  undefined2 uStack_6b4;
  undefined2 uStack_6b2;
  undefined2 uStack_6b0;
  undefined2 uStack_6ae;
  undefined2 uStack_6ac;
  undefined2 uStack_6aa;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined2 local_5b8;
  undefined2 uStack_5b6;
  undefined2 uStack_5b4;
  undefined2 uStack_5b2;
  undefined2 uStack_5b0;
  undefined2 uStack_5ae;
  undefined2 uStack_5ac;
  undefined2 uStack_5aa;
  undefined2 local_5a8;
  undefined2 uStack_5a6;
  undefined2 uStack_5a4;
  undefined2 uStack_5a2;
  undefined2 uStack_5a0;
  undefined2 uStack_59e;
  undefined2 uStack_59c;
  undefined2 uStack_59a;
  undefined2 local_598;
  undefined2 uStack_596;
  undefined2 uStack_594;
  undefined2 uStack_592;
  undefined2 uStack_590;
  undefined2 uStack_58e;
  undefined2 uStack_58c;
  undefined2 uStack_58a;
  undefined2 local_588;
  undefined2 uStack_586;
  undefined2 uStack_584;
  undefined2 uStack_582;
  undefined2 uStack_580;
  undefined2 uStack_57e;
  undefined2 uStack_57c;
  undefined2 uStack_57a;
  undefined2 local_578;
  undefined2 uStack_576;
  undefined2 uStack_574;
  undefined2 uStack_572;
  undefined2 uStack_570;
  undefined2 uStack_56e;
  undefined2 uStack_56c;
  undefined2 uStack_56a;
  undefined2 local_4f8;
  undefined2 uStack_4f6;
  undefined2 uStack_4f4;
  undefined2 uStack_4f2;
  undefined2 uStack_4f0;
  undefined2 uStack_4ee;
  undefined2 uStack_4ec;
  undefined2 uStack_4ea;
  undefined2 local_4c8;
  undefined2 uStack_4c6;
  undefined2 uStack_4c4;
  undefined2 uStack_4c2;
  undefined2 uStack_4c0;
  undefined2 uStack_4be;
  undefined2 uStack_4bc;
  undefined2 uStack_4ba;
  undefined2 local_4b8;
  undefined2 uStack_4b6;
  undefined2 uStack_4b4;
  undefined2 uStack_4b2;
  undefined2 uStack_4b0;
  undefined2 uStack_4ae;
  undefined2 uStack_4ac;
  undefined2 uStack_4aa;
  undefined2 local_478;
  undefined2 uStack_476;
  undefined2 uStack_474;
  undefined2 uStack_472;
  undefined2 uStack_470;
  undefined2 uStack_46e;
  undefined2 uStack_46c;
  undefined2 uStack_46a;
  undefined2 local_468;
  undefined2 uStack_466;
  undefined2 uStack_464;
  undefined2 uStack_462;
  undefined2 uStack_460;
  undefined2 uStack_45e;
  undefined2 uStack_45c;
  undefined2 uStack_45a;
  undefined2 local_458;
  undefined2 uStack_456;
  undefined2 uStack_454;
  undefined2 uStack_452;
  undefined2 uStack_450;
  undefined2 uStack_44e;
  undefined2 uStack_44c;
  undefined2 uStack_44a;
  longlong local_438;
  longlong lStack_430;
  __m128i local_3f8;
  undefined1 local_3b8 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 auVar26 [16];
  undefined1 auVar31 [16];
  undefined1 auVar39 [16];
  undefined1 auVar27 [16];
  undefined1 auVar32 [16];
  undefined1 auVar40 [16];
  undefined1 auVar28 [16];
  undefined1 auVar33 [16];
  undefined1 auVar41 [16];
  undefined1 auVar62 [16];
  undefined1 auVar78 [16];
  undefined1 auVar95 [16];
  undefined1 auVar63 [16];
  undefined1 auVar79 [16];
  undefined1 auVar96 [16];
  undefined1 auVar64 [16];
  undefined1 auVar80 [16];
  undefined1 auVar97 [16];
  undefined1 auVar109 [16];
  undefined1 auVar124 [16];
  undefined1 auVar110 [16];
  undefined1 auVar125 [16];
  undefined1 auVar111 [16];
  undefined1 auVar126 [16];
  undefined1 auVar145 [16];
  undefined1 auVar150 [16];
  undefined1 auVar155 [16];
  undefined1 auVar161 [16];
  undefined1 auVar172 [16];
  undefined1 auVar146 [16];
  undefined1 auVar151 [16];
  undefined1 auVar156 [16];
  undefined1 auVar162 [16];
  undefined1 auVar173 [16];
  undefined1 auVar147 [16];
  undefined1 auVar152 [16];
  undefined1 auVar157 [16];
  undefined1 auVar163 [16];
  undefined1 auVar174 [16];
  undefined1 auVar204 [16];
  undefined1 auVar209 [16];
  undefined1 auVar219 [16];
  undefined1 auVar205 [16];
  undefined1 auVar210 [16];
  undefined1 auVar220 [16];
  undefined1 auVar206 [16];
  undefined1 auVar211 [16];
  undefined1 auVar221 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar251 [16];
  undefined1 auVar266 [16];
  undefined1 auVar272 [16];
  undefined1 auVar252 [16];
  undefined1 auVar267 [16];
  undefined1 auVar273 [16];
  undefined1 auVar253 [16];
  undefined1 auVar268 [16];
  undefined1 auVar274 [16];
  undefined1 auVar301 [16];
  undefined1 auVar306 [16];
  undefined1 auVar302 [16];
  undefined1 auVar307 [16];
  undefined1 auVar303 [16];
  undefined1 auVar308 [16];
  undefined1 auVar311 [16];
  undefined1 auVar316 [16];
  undefined1 auVar321 [16];
  undefined1 auVar312 [16];
  undefined1 auVar317 [16];
  undefined1 auVar322 [16];
  undefined1 auVar313 [16];
  undefined1 auVar318 [16];
  undefined1 auVar323 [16];
  undefined1 auVar331 [16];
  undefined1 auVar337 [16];
  undefined1 auVar332 [16];
  undefined1 auVar338 [16];
  undefined1 auVar333 [16];
  undefined1 auVar339 [16];
  undefined1 auVar343 [16];
  undefined1 auVar349 [16];
  undefined1 auVar344 [16];
  undefined1 auVar350 [16];
  undefined1 auVar345 [16];
  undefined1 auVar351 [16];
  undefined1 auVar366 [16];
  undefined1 auVar372 [16];
  undefined1 auVar380 [16];
  undefined1 auVar367 [16];
  undefined1 auVar373 [16];
  undefined1 auVar381 [16];
  undefined1 auVar368 [16];
  undefined1 auVar374 [16];
  undefined1 auVar382 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar396 [16];
  undefined1 auVar403 [16];
  undefined1 auVar397 [16];
  undefined1 auVar404 [16];
  undefined1 auVar398 [16];
  undefined1 auVar405 [16];
  undefined1 auVar418 [16];
  undefined1 auVar427 [16];
  undefined1 auVar433 [16];
  undefined1 auVar419 [16];
  undefined1 auVar428 [16];
  undefined1 auVar434 [16];
  undefined1 auVar420 [16];
  undefined1 auVar429 [16];
  undefined1 auVar435 [16];
  
  local_438 = (*input)[0];
  lStack_430 = (*input)[1];
  local_3f8 = input[8];
  auVar245 = pshuflw(ZEXT416(0x328),ZEXT416(0x328),0);
  uVar1 = auVar245._0_4_;
  auVar282._4_4_ = uVar1;
  auVar282._0_4_ = uVar1;
  auVar282._8_4_ = uVar1;
  auVar282._12_4_ = uVar1;
  auVar245 = pshuflw(ZEXT416(0x7ff8),ZEXT416(0x7ff8),0);
  auVar246._0_4_ = auVar245._0_4_;
  auVar246._4_4_ = auVar246._0_4_;
  auVar246._8_4_ = auVar246._0_4_;
  auVar246._12_4_ = auVar246._0_4_;
  local_238 = pmulhrsw(auVar282,(undefined1  [16])input[1]);
  auVar247 = pmulhrsw(auVar246,(undefined1  [16])input[1]);
  auVar245 = pshuflw(ZEXT416(0xffffd1f0),ZEXT416(0xffffd1f0),0);
  uVar1 = auVar245._0_4_;
  auVar248._4_4_ = uVar1;
  auVar248._0_4_ = uVar1;
  auVar248._8_4_ = uVar1;
  auVar248._12_4_ = uVar1;
  auVar245 = pshuflw(ZEXT416(0x7770),ZEXT416(0x7770),0);
  auVar227._0_4_ = auVar245._0_4_;
  auVar227._4_4_ = auVar227._0_4_;
  auVar227._8_4_ = auVar227._0_4_;
  auVar227._12_4_ = auVar227._0_4_;
  local_218 = pmulhrsw(auVar248,(undefined1  [16])input[0xf]);
  auVar228 = pmulhrsw(auVar227,(undefined1  [16])input[0xf]);
  auVar245 = pshuflw(ZEXT416(0x1c08),ZEXT416(0x1c08),0);
  uVar1 = auVar245._0_4_;
  auVar229._4_4_ = uVar1;
  auVar229._0_4_ = uVar1;
  auVar229._8_4_ = uVar1;
  auVar229._12_4_ = uVar1;
  auVar245 = pshuflw(ZEXT416(0x7ce0),ZEXT416(0x7ce0),0);
  auVar176._0_4_ = auVar245._0_4_;
  auVar176._4_4_ = auVar176._0_4_;
  auVar176._8_4_ = auVar176._0_4_;
  auVar176._12_4_ = auVar176._0_4_;
  local_1f8 = pmulhrsw(auVar229,(undefined1  [16])input[9]);
  auVar177 = pmulhrsw(auVar176,(undefined1  [16])input[9]);
  auVar245 = pshuflw(ZEXT416(0xffffea20),ZEXT416(0xffffea20),0);
  uVar1 = auVar245._0_4_;
  auVar249._4_4_ = uVar1;
  auVar249._0_4_ = uVar1;
  auVar249._8_4_ = uVar1;
  auVar249._12_4_ = uVar1;
  auVar245 = pshuflw(ZEXT416(0x7e20),ZEXT416(0x7e20),0);
  uVar1 = auVar245._0_4_;
  auVar384._4_4_ = uVar1;
  auVar384._0_4_ = uVar1;
  auVar384._8_4_ = uVar1;
  auVar384._12_4_ = uVar1;
  local_1d8 = pmulhrsw(auVar249,(undefined1  [16])input[7]);
  local_b8 = pmulhrsw(auVar384,(undefined1  [16])input[7]);
  auVar245 = pshuflw(ZEXT416(0xfa8),ZEXT416(0xfa8),0);
  uVar1 = auVar245._0_4_;
  auVar128._4_4_ = uVar1;
  auVar128._0_4_ = uVar1;
  auVar128._8_4_ = uVar1;
  auVar128._12_4_ = uVar1;
  auVar245 = pshuflw(ZEXT416(0x7f08),ZEXT416(0x7f08),0);
  uVar1 = auVar245._0_4_;
  auVar363._4_4_ = uVar1;
  auVar363._0_4_ = uVar1;
  auVar363._8_4_ = uVar1;
  auVar363._12_4_ = uVar1;
  local_1b8 = pmulhrsw(auVar128,(undefined1  [16])input[5]);
  local_d8 = pmulhrsw(auVar363,(undefined1  [16])input[5]);
  auVar245 = pshuflw(ZEXT416(0xffffdde0),ZEXT416(0xffffdde0),0);
  uVar1 = auVar245._0_4_;
  auVar100._4_4_ = uVar1;
  auVar100._0_4_ = uVar1;
  auVar100._8_4_ = uVar1;
  auVar100._12_4_ = uVar1;
  auVar245 = pshuflw(ZEXT416(0x7b60),ZEXT416(0x7b60),0);
  auVar46._0_4_ = auVar245._0_4_;
  auVar46._4_4_ = auVar46._0_4_;
  auVar46._8_4_ = auVar46._0_4_;
  auVar46._12_4_ = auVar46._0_4_;
  local_198 = pmulhrsw(auVar100,(undefined1  [16])input[0xb]);
  auVar47 = pmulhrsw(auVar46,(undefined1  [16])input[0xb]);
  auVar245 = pshuflw(ZEXT416(0x2828),ZEXT416(0x2828),0);
  uVar1 = auVar245._0_4_;
  auVar48._4_4_ = uVar1;
  auVar48._0_4_ = uVar1;
  auVar48._8_4_ = uVar1;
  auVar48._12_4_ = uVar1;
  auVar245 = pshuflw(ZEXT416(0x7988),ZEXT416(0x7988),0);
  auVar370._0_4_ = auVar245._0_4_;
  auVar370._4_4_ = auVar370._0_4_;
  auVar370._8_4_ = auVar370._0_4_;
  auVar370._12_4_ = auVar370._0_4_;
  auVar49 = pmulhrsw(auVar48,(undefined1  [16])input[0xd]);
  auVar2 = pmulhrsw(auVar370,(undefined1  [16])input[0xd]);
  auVar245 = pshuflw(ZEXT416(0xfffff698),ZEXT416(0xfffff698),0);
  uVar1 = auVar245._0_4_;
  auVar376._4_4_ = uVar1;
  auVar376._0_4_ = uVar1;
  auVar376._8_4_ = uVar1;
  auVar376._12_4_ = uVar1;
  auVar245 = pshuflw(ZEXT416(0x7fa8),ZEXT416(0x7fa8),0);
  uVar1 = auVar245._0_4_;
  auVar50._4_4_ = uVar1;
  auVar50._0_4_ = uVar1;
  auVar50._8_4_ = uVar1;
  auVar50._12_4_ = uVar1;
  auVar3 = pmulhrsw(auVar376,(undefined1  [16])input[3]);
  auVar51 = pmulhrsw(auVar50,(undefined1  [16])input[3]);
  auVar245 = pshuflw(ZEXT416(0x648),ZEXT416(0x648),0);
  uVar1 = auVar245._0_4_;
  auVar52._4_4_ = uVar1;
  auVar52._0_4_ = uVar1;
  auVar52._8_4_ = uVar1;
  auVar52._12_4_ = uVar1;
  auVar245 = pshuflw(ZEXT416(0x7fd8),ZEXT416(0x7fd8),0);
  uVar1 = auVar245._0_4_;
  auVar401._4_4_ = uVar1;
  auVar401._0_4_ = uVar1;
  auVar401._8_4_ = uVar1;
  auVar401._12_4_ = uVar1;
  local_338 = pmulhrsw(auVar52,(undefined1  [16])input[2]);
  local_258 = pmulhrsw(auVar401,(undefined1  [16])input[2]);
  auVar245 = pshuflw(ZEXT416(0xffffd4e0),ZEXT416(0xffffd4e0),0);
  uVar1 = auVar245._0_4_;
  auVar410._4_4_ = uVar1;
  auVar410._0_4_ = uVar1;
  auVar410._8_4_ = uVar1;
  auVar410._12_4_ = uVar1;
  auVar245 = pshuflw(ZEXT416(0x7888),ZEXT416(0x7888),0);
  uVar1 = auVar245._0_4_;
  auVar53._4_4_ = uVar1;
  auVar53._0_4_ = uVar1;
  auVar53._8_4_ = uVar1;
  auVar53._12_4_ = uVar1;
  local_318 = pmulhrsw(auVar410,(undefined1  [16])input[0xe]);
  local_268 = pmulhrsw(auVar53,(undefined1  [16])input[0xe]);
  auVar245 = pshuflw(ZEXT416(0x1f18),ZEXT416(0x1f18),0);
  uVar1 = auVar245._0_4_;
  auVar431._4_4_ = uVar1;
  auVar431._0_4_ = uVar1;
  auVar431._8_4_ = uVar1;
  auVar431._12_4_ = uVar1;
  auVar245 = pshuflw(ZEXT416(0x7c28),ZEXT416(0x7c28),0);
  uVar1 = auVar245._0_4_;
  auVar54._4_4_ = uVar1;
  auVar54._0_4_ = uVar1;
  auVar54._8_4_ = uVar1;
  auVar54._12_4_ = uVar1;
  auVar4 = pmulhrsw(auVar431,(undefined1  [16])input[10]);
  auVar55 = pmulhrsw(auVar54,(undefined1  [16])input[10]);
  auVar245 = pshuflw(ZEXT416(0xffffed38),ZEXT416(0xffffed38),0);
  uVar1 = auVar245._0_4_;
  auVar5._4_4_ = uVar1;
  auVar5._0_4_ = uVar1;
  auVar5._8_4_ = uVar1;
  auVar5._12_4_ = uVar1;
  auVar245 = pshuflw(ZEXT416(0x7ea0),ZEXT416(0x7ea0),0);
  uVar1 = auVar245._0_4_;
  auVar341._4_4_ = uVar1;
  auVar341._0_4_ = uVar1;
  auVar341._8_4_ = uVar1;
  auVar341._12_4_ = uVar1;
  auVar245 = pmulhrsw(auVar5,(undefined1  [16])input[6]);
  local_2b8 = pmulhrsw(auVar341,(undefined1  [16])input[6]);
  local_818 = auVar247._0_8_;
  uStack_810 = auVar247._8_8_;
  local_48 = local_818;
  uStack_40 = uStack_810;
  local_838 = auVar228._0_8_;
  uStack_830 = auVar228._8_8_;
  local_78 = local_838;
  uStack_70 = uStack_830;
  local_718 = auVar177._0_8_;
  uStack_710 = auVar177._8_8_;
  local_88 = local_718;
  uStack_80 = uStack_710;
  local_728 = auVar47._0_8_;
  uStack_720 = auVar47._8_8_;
  local_f8 = local_728;
  uStack_f0 = uStack_720;
  local_7c8 = auVar49._0_8_;
  uStack_7c0 = auVar49._8_8_;
  local_178 = local_7c8;
  uStack_170 = uStack_7c0;
  local_738 = auVar2._0_8_;
  uStack_730 = auVar2._8_8_;
  local_108 = local_738;
  uStack_100 = uStack_730;
  local_748 = auVar3._0_8_;
  uStack_740 = auVar3._8_8_;
  local_148 = local_748;
  uStack_140 = uStack_740;
  local_758 = auVar51._0_8_;
  uStack_750 = auVar51._8_8_;
  local_138 = local_758;
  uStack_130 = uStack_750;
  local_828 = local_268._0_8_;
  uStack_820 = local_268._8_8_;
  local_278 = local_828;
  uStack_270 = uStack_820;
  local_7f8 = auVar4._0_8_;
  uStack_7f0 = auVar4._8_8_;
  local_2f8 = local_7f8;
  uStack_2f0 = uStack_7f0;
  local_7e8 = auVar55._0_8_;
  uStack_7e0 = auVar55._8_8_;
  local_288 = local_7e8;
  uStack_280 = uStack_7e0;
  local_648 = auVar245._0_8_;
  uStack_640 = auVar245._8_8_;
  local_2c8 = local_648;
  uStack_2c0 = uStack_640;
  local_168 = local_7c8;
  uStack_160 = uStack_7c0;
  local_158 = local_748;
  uStack_150 = uStack_740;
  local_128 = local_758;
  uStack_120 = uStack_750;
  local_118 = local_738;
  uStack_110 = uStack_730;
  local_e8 = local_728;
  uStack_e0 = uStack_720;
  local_98 = local_718;
  uStack_90 = uStack_710;
  local_68 = local_838;
  uStack_60 = uStack_830;
  local_58 = local_818;
  uStack_50 = uStack_810;
  auVar245 = pshuflw(ZEXT416(0xc88),ZEXT416(0xc88),0);
  auVar129._0_4_ = auVar245._0_4_;
  auVar129._4_4_ = auVar129._0_4_;
  auVar129._8_4_ = auVar129._0_4_;
  auVar129._12_4_ = auVar129._0_4_;
  local_3b8 = pmulhrsw(auVar129,(undefined1  [16])input[4]);
  auVar245 = pshuflw(ZEXT416(0x7f60),ZEXT416(0x7f60),0);
  auVar130._0_4_ = auVar245._0_4_;
  auVar130._4_4_ = auVar130._0_4_;
  auVar130._8_4_ = auVar130._0_4_;
  auVar130._12_4_ = auVar130._0_4_;
  local_348 = pmulhrsw(auVar130,(undefined1  [16])input[4]);
  auVar245 = pshuflw(ZEXT416(0xffffdad8),ZEXT416(0xffffdad8),0);
  auVar56._0_4_ = auVar245._0_4_;
  auVar56._4_4_ = auVar56._0_4_;
  auVar56._8_4_ = auVar56._0_4_;
  auVar56._12_4_ = auVar56._0_4_;
  local_388 = pmulhrsw(auVar56,(undefined1  [16])input[0xc]);
  auVar245 = pshuflw(ZEXT416(0x7a80),ZEXT416(0x7a80),0);
  auVar57._0_4_ = auVar245._0_4_;
  auVar57._4_4_ = auVar57._0_4_;
  auVar57._8_4_ = auVar57._0_4_;
  auVar57._12_4_ = auVar57._0_4_;
  local_378 = pmulhrsw(auVar57,(undefined1  [16])input[0xc]);
  local_2e8 = local_7f8;
  uStack_2e0 = uStack_7f0;
  local_2d8 = local_648;
  uStack_2d0 = uStack_640;
  local_298 = local_7e8;
  uStack_290 = uStack_7e0;
  alVar416[1]._0_4_ = 0xec80000;
  alVar416[0] = 0xf138;
  alVar416[1]._4_4_ = 0;
  local_328 = local_338;
  local_308 = local_318;
  local_2a8 = local_2b8;
  local_248 = local_258;
  local_228 = local_238;
  local_208 = local_218;
  local_1e8 = local_1f8;
  local_1c8 = local_1d8;
  local_1a8 = local_1b8;
  local_188 = local_198;
  local_c8 = local_d8;
  local_a8 = local_b8;
  idct64_stage4_high32_sse2((__m128i *)&local_438,(int32_t *)0xb50f4b0,alVar416,in_R8B);
  auVar245 = pshuflw(ZEXT416(0x18f8),ZEXT416(0x18f8),0);
  uVar1 = auVar245._0_4_;
  auVar178._4_4_ = uVar1;
  auVar178._0_4_ = uVar1;
  auVar178._8_4_ = uVar1;
  auVar178._12_4_ = uVar1;
  auVar245 = pshuflw(auVar245,ZEXT416(0x7d88),0);
  uVar1 = auVar245._0_4_;
  auVar6._4_4_ = uVar1;
  auVar6._0_4_ = uVar1;
  auVar6._8_4_ = uVar1;
  auVar6._12_4_ = uVar1;
  auVar179 = pmulhrsw(auVar178,(undefined1  [16])local_3f8);
  auVar7 = pmulhrsw(auVar6,(undefined1  [16])local_3f8);
  auVar253._0_12_ = local_328._0_12_;
  auVar253._12_2_ = local_328._6_2_;
  auVar253._14_2_ = local_258._6_2_;
  auVar252._12_4_ = auVar253._12_4_;
  auVar252._0_10_ = local_328._0_10_;
  auVar252._10_2_ = local_258._4_2_;
  auVar251._10_6_ = auVar252._10_6_;
  auVar251._0_8_ = local_328._0_8_;
  auVar251._8_2_ = local_328._4_2_;
  auVar250._8_8_ = auVar251._8_8_;
  auVar250._6_2_ = local_258._2_2_;
  auVar250._4_2_ = local_328._2_2_;
  auVar250._0_2_ = local_328._0_2_;
  auVar250._2_2_ = local_258._0_2_;
  auVar13._2_2_ = local_258._8_2_;
  auVar13._0_2_ = local_328._8_2_;
  auVar13._4_2_ = local_328._10_2_;
  auVar13._6_2_ = local_258._10_2_;
  auVar13._8_2_ = local_328._12_2_;
  auVar13._10_2_ = local_258._12_2_;
  auVar13._12_2_ = local_328._14_2_;
  auVar13._14_2_ = local_258._14_2_;
  auVar180._8_4_ = 0x31ff04f;
  auVar180._0_8_ = 0x31ff04f031ff04f;
  auVar180._12_4_ = 0x31ff04f;
  auVar4 = pmaddwd(auVar250,auVar180);
  auVar2 = pmaddwd(auVar13,auVar180);
  auVar58._8_4_ = 0xfb1031f;
  auVar58._0_8_ = 0xfb1031f0fb1031f;
  auVar58._12_4_ = 0xfb1031f;
  auVar3 = pmaddwd(auVar250,auVar58);
  auVar245 = pmaddwd(auVar13,auVar58);
  auVar283._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar283._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar283._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar283._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar8._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar8._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar8._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar8._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar284 = packssdw(auVar283,auVar8);
  auVar254._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar254._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar254._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar254._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar103._0_4_ = auVar245._0_4_ + 0x800 >> 0xc;
  auVar103._4_4_ = auVar245._4_4_ + 0x800 >> 0xc;
  auVar103._8_4_ = auVar245._8_4_ + 0x800 >> 0xc;
  auVar103._12_4_ = auVar245._12_4_ + 0x800 >> 0xc;
  auVar255 = packssdw(auVar254,auVar103);
  auVar398._0_12_ = local_318._0_12_;
  auVar398._12_2_ = local_318._6_2_;
  auVar398._14_2_ = local_268._6_2_;
  auVar397._12_4_ = auVar398._12_4_;
  auVar397._0_10_ = local_318._0_10_;
  auVar397._10_2_ = local_268._4_2_;
  auVar396._10_6_ = auVar397._10_6_;
  auVar396._0_8_ = local_318._0_8_;
  auVar396._8_2_ = local_318._4_2_;
  auVar395._8_8_ = auVar396._8_8_;
  auVar395._6_2_ = local_268._2_2_;
  auVar395._4_2_ = local_318._2_2_;
  auVar395._0_2_ = local_318._0_2_;
  auVar395._2_2_ = local_268._0_2_;
  auVar135._2_2_ = local_268._8_2_;
  auVar135._0_2_ = local_318._8_2_;
  auVar135._4_2_ = local_318._10_2_;
  auVar135._6_2_ = local_268._10_2_;
  auVar135._8_2_ = local_318._12_2_;
  auVar135._10_2_ = local_268._12_2_;
  auVar135._12_2_ = local_318._14_2_;
  auVar135._14_2_ = local_268._14_2_;
  auVar59._8_4_ = 0xf04ffce1;
  auVar59._0_8_ = 0xf04ffce1f04ffce1;
  auVar59._12_4_ = 0xf04ffce1;
  auVar3 = pmaddwd(auVar395,auVar59);
  auVar2 = pmaddwd(auVar135,auVar59);
  auVar4 = pmaddwd(auVar395,auVar180);
  auVar245 = pmaddwd(auVar135,auVar180);
  auVar101._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar101._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar101._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar101._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar9._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar9._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar9._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar9._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar47 = packssdw(auVar101,auVar9);
  auVar399._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar399._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar399._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar399._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar181._0_4_ = auVar245._0_4_ + 0x800 >> 0xc;
  auVar181._4_4_ = auVar245._4_4_ + 0x800 >> 0xc;
  auVar181._8_4_ = auVar245._8_4_ + 0x800 >> 0xc;
  auVar181._12_4_ = auVar245._12_4_ + 0x800 >> 0xc;
  auVar400 = packssdw(auVar399,auVar181);
  auVar3._8_8_ = uStack_2e0;
  auVar3._0_8_ = local_2e8;
  auVar420._0_12_ = auVar3._0_12_;
  auVar420._12_2_ = (short)((ulong)local_2e8 >> 0x30);
  auVar420._14_2_ = local_298._6_2_;
  auVar419._12_4_ = auVar420._12_4_;
  auVar419._0_10_ = auVar3._0_10_;
  auVar419._10_2_ = local_298._4_2_;
  auVar418._10_6_ = auVar419._10_6_;
  auVar418._8_2_ = (short)((ulong)local_2e8 >> 0x20);
  auVar418._0_8_ = local_2e8;
  auVar417._8_8_ = auVar418._8_8_;
  auVar417._6_2_ = local_298._2_2_;
  auVar417._4_2_ = (short)((ulong)local_2e8 >> 0x10);
  auVar417._0_2_ = (undefined2)local_2e8;
  auVar417._2_2_ = (undefined2)local_298;
  auVar66._2_2_ = (undefined2)uStack_290;
  auVar66._0_2_ = (short)uStack_2e0;
  auVar66._4_2_ = (short)((ulong)uStack_2e0 >> 0x10);
  auVar66._6_2_ = uStack_290._2_2_;
  auVar66._8_2_ = (short)((ulong)uStack_2e0 >> 0x20);
  auVar66._10_2_ = uStack_290._4_2_;
  auVar66._12_2_ = (short)((ulong)uStack_2e0 >> 0x30);
  auVar66._14_2_ = uStack_290._6_2_;
  auVar102._8_4_ = 0xd4ef71c;
  auVar102._0_8_ = 0xd4ef71c0d4ef71c;
  auVar102._12_4_ = 0xd4ef71c;
  auVar2 = pmaddwd(auVar417,auVar102);
  auVar245 = pmaddwd(auVar66,auVar102);
  auVar60._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar60._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar60._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar60._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar10._0_4_ = auVar245._0_4_ + 0x800 >> 0xc;
  auVar10._4_4_ = auVar245._4_4_ + 0x800 >> 0xc;
  auVar10._8_4_ = auVar245._8_4_ + 0x800 >> 0xc;
  auVar10._12_4_ = auVar245._12_4_ + 0x800 >> 0xc;
  auVar49 = packssdw(auVar60,auVar10);
  auVar11._8_4_ = 0x8e40d4e;
  auVar11._0_8_ = 0x8e40d4e08e40d4e;
  auVar11._12_4_ = 0x8e40d4e;
  auVar2 = pmaddwd(auVar417,auVar11);
  auVar245 = pmaddwd(auVar66,auVar11);
  auVar421._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar421._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar421._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar421._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar422._0_4_ = auVar245._0_4_ + 0x800 >> 0xc;
  auVar422._4_4_ = auVar245._4_4_ + 0x800 >> 0xc;
  auVar422._8_4_ = auVar245._8_4_ + 0x800 >> 0xc;
  auVar422._12_4_ = auVar245._12_4_ + 0x800 >> 0xc;
  auVar422 = packssdw(auVar421,auVar422);
  auVar4._8_8_ = uStack_2d0;
  auVar4._0_8_ = local_2d8;
  auVar64._0_12_ = auVar4._0_12_;
  auVar64._12_2_ = (short)((ulong)local_2d8 >> 0x30);
  auVar64._14_2_ = local_2a8._6_2_;
  auVar63._12_4_ = auVar64._12_4_;
  auVar63._0_10_ = auVar4._0_10_;
  auVar63._10_2_ = local_2a8._4_2_;
  auVar62._10_6_ = auVar63._10_6_;
  auVar62._8_2_ = (short)((ulong)local_2d8 >> 0x20);
  auVar62._0_8_ = local_2d8;
  auVar61._8_8_ = auVar62._8_8_;
  auVar61._6_2_ = local_2a8._2_2_;
  auVar61._4_2_ = (short)((ulong)local_2d8 >> 0x10);
  auVar61._0_2_ = (undefined2)local_2d8;
  auVar61._2_2_ = local_2a8._0_2_;
  auVar285._2_2_ = local_2a8._8_2_;
  auVar285._0_2_ = (short)uStack_2d0;
  auVar285._4_2_ = (short)((ulong)uStack_2d0 >> 0x10);
  auVar285._6_2_ = local_2a8._10_2_;
  auVar285._8_2_ = (short)((ulong)uStack_2d0 >> 0x20);
  auVar285._10_2_ = local_2a8._12_2_;
  auVar285._12_2_ = (short)((ulong)uStack_2d0 >> 0x30);
  auVar285._14_2_ = local_2a8._14_2_;
  auVar131._8_4_ = 0xf71cf2b2;
  auVar131._0_8_ = 0xf71cf2b2f71cf2b2;
  auVar131._12_4_ = 0xf71cf2b2;
  auVar2 = pmaddwd(auVar61,auVar131);
  auVar245 = pmaddwd(auVar285,auVar131);
  auVar256._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar256._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar256._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar256._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar12._0_4_ = auVar245._0_4_ + 0x800 >> 0xc;
  auVar12._4_4_ = auVar245._4_4_ + 0x800 >> 0xc;
  auVar12._8_4_ = auVar245._8_4_ + 0x800 >> 0xc;
  auVar12._12_4_ = auVar245._12_4_ + 0x800 >> 0xc;
  auVar51 = packssdw(auVar256,auVar12);
  auVar2 = pmaddwd(auVar61,auVar102);
  auVar245 = pmaddwd(auVar285,auVar102);
  auVar65._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar65._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar65._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar65._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar132._0_4_ = auVar245._0_4_ + 0x800 >> 0xc;
  auVar132._4_4_ = auVar245._4_4_ + 0x800 >> 0xc;
  auVar132._8_4_ = auVar245._8_4_ + 0x800 >> 0xc;
  auVar132._12_4_ = auVar245._12_4_ + 0x800 >> 0xc;
  auVar4 = packssdw(auVar65,auVar132);
  auVar13 = paddsw(local_238,local_208);
  auVar103 = psubsw(local_238,local_208);
  auVar66 = paddsw(local_228,local_218);
  auVar245 = psubsw(local_228,local_218);
  auVar3 = psubsw(local_1c8,local_1f8);
  auVar132 = paddsw(local_1c8,local_1f8);
  auVar385 = psubsw(local_1d8,local_1e8);
  auVar133 = paddsw(local_1d8,local_1e8);
  auVar134 = paddsw(local_1b8,local_188);
  auVar181 = psubsw(local_1b8,local_188);
  auVar182 = paddsw(local_1a8,local_198);
  auVar135 = psubsw(local_1a8,local_198);
  auVar247._8_8_ = uStack_140;
  auVar247._0_8_ = local_148;
  auVar55._8_8_ = uStack_170;
  auVar55._0_8_ = local_178;
  auVar285 = psubsw(auVar247,auVar55);
  auVar183 = paddsw(auVar247,auVar55);
  auVar228._8_8_ = uStack_150;
  auVar228._0_8_ = local_158;
  auVar177._8_8_ = uStack_160;
  auVar177._0_8_ = local_168;
  auVar55 = psubsw(auVar228,auVar177);
  auVar184 = paddsw(auVar228,auVar177);
  auVar74._8_8_ = uStack_130;
  auVar74._0_8_ = local_138;
  auVar258._8_8_ = uStack_100;
  auVar258._0_8_ = local_108;
  auVar185 = paddsw(auVar74,auVar258);
  auVar177 = psubsw(auVar74,auVar258);
  auVar288._8_8_ = uStack_120;
  auVar288._0_8_ = local_128;
  auVar231._8_8_ = uStack_110;
  auVar231._0_8_ = local_118;
  auVar186 = paddsw(auVar288,auVar231);
  auVar247 = psubsw(auVar288,auVar231);
  auVar187._8_8_ = uStack_f0;
  auVar187._0_8_ = local_f8;
  auVar286 = psubsw(local_c8,auVar187);
  auVar187 = paddsw(local_c8,auVar187);
  auVar188._8_8_ = uStack_e0;
  auVar188._0_8_ = local_e8;
  auVar287 = psubsw(local_d8,auVar188);
  auVar188 = paddsw(local_d8,auVar188);
  auVar290._8_8_ = uStack_80;
  auVar290._0_8_ = local_88;
  auVar189 = paddsw(local_b8,auVar290);
  auVar288 = psubsw(local_b8,auVar290);
  auVar289._8_8_ = uStack_90;
  auVar289._0_8_ = local_98;
  auVar190 = paddsw(local_a8,auVar289);
  auVar289 = psubsw(local_a8,auVar289);
  auVar291._8_8_ = uStack_40;
  auVar291._0_8_ = local_48;
  auVar191._8_8_ = uStack_70;
  auVar191._0_8_ = local_78;
  auVar290 = psubsw(auVar291,auVar191);
  auVar191 = paddsw(auVar291,auVar191);
  auVar82._8_8_ = uStack_50;
  auVar82._0_8_ = local_58;
  auVar192._8_8_ = uStack_60;
  auVar192._0_8_ = local_68;
  auVar291 = psubsw(auVar82,auVar192);
  auVar192 = paddsw(auVar82,auVar192);
  auVar345._0_12_ = local_3b8._0_12_;
  auVar345._12_2_ = local_3b8._6_2_;
  auVar345._14_2_ = local_348._6_2_;
  auVar344._12_4_ = auVar345._12_4_;
  auVar344._0_10_ = local_3b8._0_10_;
  auVar344._10_2_ = local_348._4_2_;
  auVar343._10_6_ = auVar344._10_6_;
  auVar343._0_8_ = local_3b8._0_8_;
  auVar343._8_2_ = local_3b8._4_2_;
  auVar342._8_8_ = auVar343._8_8_;
  auVar342._6_2_ = local_348._2_2_;
  auVar342._4_2_ = local_3b8._2_2_;
  auVar342._0_2_ = local_3b8._0_2_;
  auVar342._2_2_ = local_348._0_2_;
  auVar67._2_2_ = local_348._8_2_;
  auVar67._0_2_ = local_3b8._8_2_;
  auVar67._4_2_ = local_3b8._10_2_;
  auVar67._6_2_ = local_348._10_2_;
  auVar67._8_2_ = local_3b8._12_2_;
  auVar67._10_2_ = local_348._12_2_;
  auVar67._12_2_ = local_3b8._14_2_;
  auVar67._14_2_ = local_348._14_2_;
  auVar325._8_4_ = 0x61ff138;
  auVar325._0_8_ = 0x61ff138061ff138;
  auVar325._12_4_ = 0x61ff138;
  auVar228 = pmaddwd(auVar342,auVar325);
  auVar2 = pmaddwd(auVar67,auVar325);
  auVar292._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar292._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar292._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar292._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar193._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar193._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar193._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar193._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar293 = packssdw(auVar292,auVar193);
  auVar194._8_4_ = 0xec8061f;
  auVar194._0_8_ = 0xec8061f0ec8061f;
  auVar194._12_4_ = 0xec8061f;
  auVar228 = pmaddwd(auVar342,auVar194);
  auVar2 = pmaddwd(auVar67,auVar194);
  auVar346._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar346._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar346._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar346._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar68._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar68._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar68._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar68._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar347 = packssdw(auVar346,auVar68);
  auVar69 = paddsw(local_3b8,local_388);
  auVar364 = psubsw(local_3b8,local_388);
  local_828._0_2_ = local_378._0_2_;
  local_828._2_2_ = local_378._2_2_;
  local_828._4_2_ = local_378._4_2_;
  local_828._6_2_ = local_378._6_2_;
  uStack_820._0_2_ = local_378._8_2_;
  uStack_820._2_2_ = local_378._10_2_;
  uStack_820._4_2_ = local_378._12_2_;
  uStack_820._6_2_ = local_378._14_2_;
  auVar351._0_12_ = local_388._0_12_;
  auVar351._12_2_ = local_388._6_2_;
  auVar351._14_2_ = local_828._6_2_;
  auVar350._12_4_ = auVar351._12_4_;
  auVar350._0_10_ = local_388._0_10_;
  auVar350._10_2_ = local_828._4_2_;
  auVar349._10_6_ = auVar350._10_6_;
  auVar349._0_8_ = local_388._0_8_;
  auVar349._8_2_ = local_388._4_2_;
  auVar348._8_8_ = auVar349._8_8_;
  auVar348._6_2_ = local_828._2_2_;
  auVar348._4_2_ = local_388._2_2_;
  auVar348._0_2_ = local_388._0_2_;
  auVar348._2_2_ = (undefined2)local_828;
  auVar195._2_2_ = (undefined2)uStack_820;
  auVar195._0_2_ = local_388._8_2_;
  auVar195._4_2_ = local_388._10_2_;
  auVar195._6_2_ = uStack_820._2_2_;
  auVar195._8_2_ = local_388._12_2_;
  auVar195._10_2_ = uStack_820._4_2_;
  auVar195._12_2_ = local_388._14_2_;
  auVar195._14_2_ = uStack_820._6_2_;
  auVar70._8_4_ = 0xf138f9e1;
  auVar70._0_8_ = 0xf138f9e1f138f9e1;
  auVar70._12_4_ = 0xf138f9e1;
  auVar228 = pmaddwd(auVar348,auVar70);
  auVar2 = pmaddwd(auVar195,auVar70);
  auVar294._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar294._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar294._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar294._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar230._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar230._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar230._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar230._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar295 = packssdw(auVar294,auVar230);
  auVar228 = pmaddwd(auVar348,auVar325);
  auVar2 = pmaddwd(auVar195,auVar325);
  auVar352._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar352._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar352._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar352._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar196._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar196._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar196._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar196._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar353 = packssdw(auVar352,auVar196);
  auVar71 = paddsw(local_338,local_308);
  auVar231 = psubsw(local_338,local_308);
  auVar197 = paddsw(auVar284,auVar47);
  auVar326 = psubsw(auVar284,auVar47);
  auVar47._8_8_ = uStack_2c0;
  auVar47._0_8_ = local_2c8;
  auVar2._8_8_ = uStack_2f0;
  auVar2._0_8_ = local_2f8;
  auVar354 = psubsw(auVar47,auVar2);
  auVar72 = paddsw(auVar47,auVar2);
  auVar327 = psubsw(auVar51,auVar49);
  auVar257 = paddsw(auVar51,auVar49);
  auVar49._8_8_ = uStack_280;
  auVar49._0_8_ = local_288;
  auVar73 = paddsw(local_2b8,auVar49);
  auVar258 = psubsw(local_2b8,auVar49);
  auVar198 = paddsw(auVar4,auVar422);
  auVar74 = psubsw(auVar4,auVar422);
  auVar51._8_8_ = uStack_270;
  auVar51._0_8_ = local_278;
  auVar422 = psubsw(local_248,auVar51);
  auVar75 = paddsw(local_248,auVar51);
  auVar228 = psubsw(auVar255,auVar400);
  auVar401 = paddsw(auVar400,auVar255);
  local_808 = auVar291._0_2_;
  uStack_806 = auVar291._2_2_;
  uStack_804 = auVar291._4_2_;
  uStack_802 = auVar291._6_2_;
  uStack_800 = auVar291._8_2_;
  uStack_7fe = auVar291._10_2_;
  uStack_7fc = auVar291._12_2_;
  uStack_7fa = auVar291._14_2_;
  auVar368._0_12_ = auVar245._0_12_;
  auVar368._12_2_ = auVar245._6_2_;
  auVar368._14_2_ = uStack_802;
  auVar367._12_4_ = auVar368._12_4_;
  auVar367._0_10_ = auVar245._0_10_;
  auVar367._10_2_ = uStack_804;
  auVar366._10_6_ = auVar367._10_6_;
  auVar366._0_8_ = auVar245._0_8_;
  auVar366._8_2_ = auVar245._4_2_;
  auVar365._8_8_ = auVar366._8_8_;
  auVar365._6_2_ = uStack_806;
  auVar365._4_2_ = auVar245._2_2_;
  auVar365._0_2_ = auVar245._0_2_;
  auVar365._2_2_ = local_808;
  auVar255._2_2_ = uStack_800;
  auVar255._0_2_ = auVar245._8_2_;
  auVar255._4_2_ = auVar245._10_2_;
  auVar255._6_2_ = uStack_7fe;
  auVar255._8_2_ = auVar245._12_2_;
  auVar255._10_2_ = uStack_7fc;
  auVar255._12_2_ = auVar245._14_2_;
  auVar255._14_2_ = uStack_7fa;
  auVar2 = pmaddwd(auVar365,auVar180);
  auVar245 = pmaddwd(auVar255,auVar180);
  auVar259._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar259._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar259._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar259._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar199._0_4_ = auVar245._0_4_ + 0x800 >> 0xc;
  auVar199._4_4_ = auVar245._4_4_ + 0x800 >> 0xc;
  auVar199._8_4_ = auVar245._8_4_ + 0x800 >> 0xc;
  auVar199._12_4_ = auVar245._12_4_ + 0x800 >> 0xc;
  auVar260 = packssdw(auVar259,auVar199);
  auVar2 = pmaddwd(auVar365,auVar58);
  auVar245 = pmaddwd(auVar255,auVar58);
  auVar369._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar369._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar369._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar369._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar284._0_4_ = auVar245._0_4_ + 0x800 >> 0xc;
  auVar284._4_4_ = auVar245._4_4_ + 0x800 >> 0xc;
  auVar284._8_4_ = auVar245._8_4_ + 0x800 >> 0xc;
  auVar284._12_4_ = auVar245._12_4_ + 0x800 >> 0xc;
  auVar370 = packssdw(auVar369,auVar284);
  local_5b8 = auVar290._0_2_;
  uStack_5b6 = auVar290._2_2_;
  uStack_5b4 = auVar290._4_2_;
  uStack_5b2 = auVar290._6_2_;
  uStack_5b0 = auVar290._8_2_;
  uStack_5ae = auVar290._10_2_;
  uStack_5ac = auVar290._12_2_;
  uStack_5aa = auVar290._14_2_;
  auVar374._0_12_ = auVar103._0_12_;
  auVar374._12_2_ = auVar103._6_2_;
  auVar374._14_2_ = uStack_5b2;
  auVar373._12_4_ = auVar374._12_4_;
  auVar373._0_10_ = auVar103._0_10_;
  auVar373._10_2_ = uStack_5b4;
  auVar372._10_6_ = auVar373._10_6_;
  auVar372._0_8_ = auVar103._0_8_;
  auVar372._8_2_ = auVar103._4_2_;
  auVar371._8_8_ = auVar372._8_8_;
  auVar371._6_2_ = uStack_5b6;
  auVar371._4_2_ = auVar103._2_2_;
  auVar371._0_2_ = auVar103._0_2_;
  auVar371._2_2_ = local_5b8;
  auVar104._2_2_ = uStack_5b0;
  auVar104._0_2_ = auVar103._8_2_;
  auVar104._4_2_ = auVar103._10_2_;
  auVar104._6_2_ = uStack_5ae;
  auVar104._8_2_ = auVar103._12_2_;
  auVar104._10_2_ = uStack_5ac;
  auVar104._12_2_ = auVar103._14_2_;
  auVar104._14_2_ = uStack_5aa;
  auVar4 = pmaddwd(auVar371,auVar58);
  auVar245 = pmaddwd(auVar104,auVar58);
  auVar47 = pmaddwd(auVar371,auVar180);
  auVar2 = pmaddwd(auVar104,auVar180);
  auVar423._0_4_ = auVar47._0_4_ + 0x800 >> 0xc;
  auVar423._4_4_ = auVar47._4_4_ + 0x800 >> 0xc;
  auVar423._8_4_ = auVar47._8_4_ + 0x800 >> 0xc;
  auVar423._12_4_ = auVar47._12_4_ + 0x800 >> 0xc;
  auVar200._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar200._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar200._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar200._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar284 = packssdw(auVar423,auVar200);
  auVar375._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar375._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar375._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar375._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar105._0_4_ = auVar245._0_4_ + 0x800 >> 0xc;
  auVar105._4_4_ = auVar245._4_4_ + 0x800 >> 0xc;
  auVar105._8_4_ = auVar245._8_4_ + 0x800 >> 0xc;
  auVar105._12_4_ = auVar245._12_4_ + 0x800 >> 0xc;
  auVar376 = packssdw(auVar375,auVar105);
  local_708 = auVar288._0_2_;
  uStack_706 = auVar288._2_2_;
  uStack_704 = auVar288._4_2_;
  uStack_702 = auVar288._6_2_;
  uStack_700 = auVar288._8_2_;
  uStack_6fe = auVar288._10_2_;
  uStack_6fc = auVar288._12_2_;
  uStack_6fa = auVar288._14_2_;
  auVar400._0_12_ = auVar3._0_12_;
  auVar400._12_2_ = auVar3._6_2_;
  auVar400._14_2_ = uStack_702;
  auVar36._12_4_ = auVar400._12_4_;
  auVar36._0_10_ = auVar3._0_10_;
  auVar36._10_2_ = uStack_704;
  auVar407._10_6_ = auVar36._10_6_;
  auVar407._0_8_ = auVar3._0_8_;
  auVar407._8_2_ = auVar3._4_2_;
  auVar35._8_8_ = auVar407._8_8_;
  auVar35._6_2_ = uStack_706;
  auVar35._4_2_ = auVar3._2_2_;
  auVar35._0_2_ = auVar3._0_2_;
  auVar35._2_2_ = local_708;
  auVar14._2_2_ = uStack_700;
  auVar14._0_2_ = auVar3._8_2_;
  auVar14._4_2_ = auVar3._10_2_;
  auVar14._6_2_ = uStack_6fe;
  auVar14._8_2_ = auVar3._12_2_;
  auVar14._10_2_ = uStack_6fc;
  auVar14._12_2_ = auVar3._14_2_;
  auVar14._14_2_ = uStack_6fa;
  auVar2 = pmaddwd(auVar35,auVar59);
  auVar245 = pmaddwd(auVar14,auVar59);
  auVar261._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar261._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar261._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar261._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar106._0_4_ = auVar245._0_4_ + 0x800 >> 0xc;
  auVar106._4_4_ = auVar245._4_4_ + 0x800 >> 0xc;
  auVar106._8_4_ = auVar245._8_4_ + 0x800 >> 0xc;
  auVar106._12_4_ = auVar245._12_4_ + 0x800 >> 0xc;
  auVar255 = packssdw(auVar261,auVar106);
  auVar245 = pmaddwd(auVar35,auVar180);
  auVar2 = pmaddwd(auVar14,auVar180);
  auVar141._0_4_ = auVar245._0_4_ + 0x800 >> 0xc;
  auVar141._4_4_ = auVar245._4_4_ + 0x800 >> 0xc;
  auVar141._8_4_ = auVar245._8_4_ + 0x800 >> 0xc;
  auVar141._12_4_ = auVar245._12_4_ + 0x800 >> 0xc;
  auVar15._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar15._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar15._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar15._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar2 = packssdw(auVar141,auVar15);
  local_6f8 = auVar289._0_2_;
  uStack_6f6 = auVar289._2_2_;
  uStack_6f4 = auVar289._4_2_;
  uStack_6f2 = auVar289._6_2_;
  uStack_6f0 = auVar289._8_2_;
  uStack_6ee = auVar289._10_2_;
  uStack_6ec = auVar289._12_2_;
  uStack_6ea = auVar289._14_2_;
  auVar270._0_12_ = auVar385._0_12_;
  auVar270._12_2_ = auVar385._6_2_;
  auVar270._14_2_ = uStack_6f2;
  auVar217._12_4_ = auVar270._12_4_;
  auVar217._0_10_ = auVar385._0_10_;
  auVar217._10_2_ = uStack_6f4;
  auVar215._10_6_ = auVar217._10_6_;
  auVar215._0_8_ = auVar385._0_8_;
  auVar215._8_2_ = auVar385._4_2_;
  auVar213._8_8_ = auVar215._8_8_;
  auVar213._6_2_ = uStack_6f6;
  auVar213._4_2_ = auVar385._2_2_;
  auVar213._0_2_ = auVar385._0_2_;
  auVar213._2_2_ = local_6f8;
  auVar386._2_2_ = uStack_6f0;
  auVar386._0_2_ = auVar385._8_2_;
  auVar386._4_2_ = auVar385._10_2_;
  auVar386._6_2_ = uStack_6ee;
  auVar386._8_2_ = auVar385._12_2_;
  auVar386._10_2_ = uStack_6ec;
  auVar386._12_2_ = auVar385._14_2_;
  auVar386._14_2_ = uStack_6ea;
  auVar4 = pmaddwd(auVar213,auVar59);
  auVar3 = pmaddwd(auVar59,auVar386);
  auVar245 = pmaddwd(auVar213,auVar180);
  auVar47 = pmaddwd(auVar386,auVar180);
  auVar107._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar107._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar107._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar107._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar16._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar16._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar16._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar16._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar288 = packssdw(auVar107,auVar16);
  auVar385._0_4_ = auVar245._0_4_ + 0x800 >> 0xc;
  auVar385._4_4_ = auVar245._4_4_ + 0x800 >> 0xc;
  auVar385._8_4_ = auVar245._8_4_ + 0x800 >> 0xc;
  auVar385._12_4_ = auVar245._12_4_ + 0x800 >> 0xc;
  auVar387._0_4_ = auVar47._0_4_ + 0x800 >> 0xc;
  auVar387._4_4_ = auVar47._4_4_ + 0x800 >> 0xc;
  auVar387._8_4_ = auVar47._8_4_ + 0x800 >> 0xc;
  auVar387._12_4_ = auVar47._12_4_ + 0x800 >> 0xc;
  auVar3 = packssdw(auVar385,auVar387);
  local_6e8 = auVar287._0_2_;
  uStack_6e6 = auVar287._2_2_;
  uStack_6e4 = auVar287._4_2_;
  uStack_6e2 = auVar287._6_2_;
  uStack_6e0 = auVar287._8_2_;
  uStack_6de = auVar287._10_2_;
  uStack_6dc = auVar287._12_2_;
  uStack_6da = auVar287._14_2_;
  auVar405._0_12_ = auVar135._0_12_;
  auVar405._12_2_ = auVar135._6_2_;
  auVar405._14_2_ = uStack_6e2;
  auVar404._12_4_ = auVar405._12_4_;
  auVar404._0_10_ = auVar135._0_10_;
  auVar404._10_2_ = uStack_6e4;
  auVar403._10_6_ = auVar404._10_6_;
  auVar403._0_8_ = auVar135._0_8_;
  auVar403._8_2_ = auVar135._4_2_;
  auVar402._8_8_ = auVar403._8_8_;
  auVar402._6_2_ = uStack_6e6;
  auVar402._4_2_ = auVar135._2_2_;
  auVar402._0_2_ = auVar135._0_2_;
  auVar402._2_2_ = local_6e8;
  auVar136._2_2_ = uStack_6e0;
  auVar136._0_2_ = auVar135._8_2_;
  auVar136._4_2_ = auVar135._10_2_;
  auVar136._6_2_ = uStack_6de;
  auVar136._8_2_ = auVar135._12_2_;
  auVar136._10_2_ = uStack_6dc;
  auVar136._12_2_ = auVar135._14_2_;
  auVar136._14_2_ = uStack_6da;
  auVar245 = pmaddwd(auVar402,auVar102);
  auVar4 = pmaddwd(auVar136,auVar102);
  auVar287._0_4_ = auVar245._0_4_ + 0x800 >> 0xc;
  auVar287._4_4_ = auVar245._4_4_ + 0x800 >> 0xc;
  auVar287._8_4_ = auVar245._8_4_ + 0x800 >> 0xc;
  auVar287._12_4_ = auVar245._12_4_ + 0x800 >> 0xc;
  auVar17._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar17._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar17._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar17._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar4 = packssdw(auVar287,auVar17);
  auVar47 = pmaddwd(auVar402,auVar11);
  auVar245 = pmaddwd(auVar136,auVar11);
  auVar406._0_4_ = auVar47._0_4_ + 0x800 >> 0xc;
  auVar406._4_4_ = auVar47._4_4_ + 0x800 >> 0xc;
  auVar406._8_4_ = auVar47._8_4_ + 0x800 >> 0xc;
  auVar406._12_4_ = auVar47._12_4_ + 0x800 >> 0xc;
  auVar137._0_4_ = auVar245._0_4_ + 0x800 >> 0xc;
  auVar137._4_4_ = auVar245._4_4_ + 0x800 >> 0xc;
  auVar137._8_4_ = auVar245._8_4_ + 0x800 >> 0xc;
  auVar137._12_4_ = auVar245._12_4_ + 0x800 >> 0xc;
  auVar407 = packssdw(auVar406,auVar137);
  local_588 = auVar286._0_2_;
  uStack_586 = auVar286._2_2_;
  uStack_584 = auVar286._4_2_;
  uStack_582 = auVar286._6_2_;
  uStack_580 = auVar286._8_2_;
  uStack_57e = auVar286._10_2_;
  uStack_57c = auVar286._12_2_;
  uStack_57a = auVar286._14_2_;
  auVar111._0_12_ = auVar181._0_12_;
  auVar111._12_2_ = auVar181._6_2_;
  auVar111._14_2_ = uStack_582;
  auVar110._12_4_ = auVar111._12_4_;
  auVar110._0_10_ = auVar181._0_10_;
  auVar110._10_2_ = uStack_584;
  auVar109._10_6_ = auVar110._10_6_;
  auVar109._0_8_ = auVar181._0_8_;
  auVar109._8_2_ = auVar181._4_2_;
  auVar108._8_8_ = auVar109._8_8_;
  auVar108._6_2_ = uStack_586;
  auVar108._4_2_ = auVar181._2_2_;
  auVar108._0_2_ = auVar181._0_2_;
  auVar108._2_2_ = local_588;
  auVar201._2_2_ = uStack_580;
  auVar201._0_2_ = auVar181._8_2_;
  auVar201._4_2_ = auVar181._10_2_;
  auVar201._6_2_ = uStack_57e;
  auVar201._8_2_ = auVar181._12_2_;
  auVar201._10_2_ = uStack_57c;
  auVar201._12_2_ = auVar181._14_2_;
  auVar201._14_2_ = uStack_57a;
  auVar47 = pmaddwd(auVar108,auVar11);
  auVar49 = pmaddwd(auVar201,auVar11);
  auVar51 = pmaddwd(auVar108,auVar102);
  auVar245 = pmaddwd(auVar201,auVar102);
  auVar388._0_4_ = auVar51._0_4_ + 0x800 >> 0xc;
  auVar388._4_4_ = auVar51._4_4_ + 0x800 >> 0xc;
  auVar388._8_4_ = auVar51._8_4_ + 0x800 >> 0xc;
  auVar388._12_4_ = auVar51._12_4_ + 0x800 >> 0xc;
  auVar18._0_4_ = auVar245._0_4_ + 0x800 >> 0xc;
  auVar18._4_4_ = auVar245._4_4_ + 0x800 >> 0xc;
  auVar18._8_4_ = auVar245._8_4_ + 0x800 >> 0xc;
  auVar18._12_4_ = auVar245._12_4_ + 0x800 >> 0xc;
  auVar400 = packssdw(auVar388,auVar18);
  auVar112._0_4_ = auVar47._0_4_ + 0x800 >> 0xc;
  auVar112._4_4_ = auVar47._4_4_ + 0x800 >> 0xc;
  auVar112._8_4_ = auVar47._8_4_ + 0x800 >> 0xc;
  auVar112._12_4_ = auVar47._12_4_ + 0x800 >> 0xc;
  auVar202._0_4_ = auVar49._0_4_ + 0x800 >> 0xc;
  auVar202._4_4_ = auVar49._4_4_ + 0x800 >> 0xc;
  auVar202._8_4_ = auVar49._8_4_ + 0x800 >> 0xc;
  auVar202._12_4_ = auVar49._12_4_ + 0x800 >> 0xc;
  auVar290 = packssdw(auVar112,auVar202);
  local_478 = auVar177._0_2_;
  uStack_476 = auVar177._2_2_;
  uStack_474 = auVar177._4_2_;
  uStack_472 = auVar177._6_2_;
  uStack_470 = auVar177._8_2_;
  uStack_46e = auVar177._10_2_;
  uStack_46c = auVar177._12_2_;
  uStack_46a = auVar177._14_2_;
  auVar206._0_12_ = auVar285._0_12_;
  auVar206._12_2_ = auVar285._6_2_;
  auVar206._14_2_ = uStack_472;
  auVar205._12_4_ = auVar206._12_4_;
  auVar205._0_10_ = auVar285._0_10_;
  auVar205._10_2_ = uStack_474;
  auVar204._10_6_ = auVar205._10_6_;
  auVar204._0_8_ = auVar285._0_8_;
  auVar204._8_2_ = auVar285._4_2_;
  auVar203._8_8_ = auVar204._8_8_;
  auVar203._6_2_ = uStack_476;
  auVar203._4_2_ = auVar285._2_2_;
  auVar203._0_2_ = auVar285._0_2_;
  auVar203._2_2_ = local_478;
  auVar262._2_2_ = uStack_470;
  auVar262._0_2_ = auVar285._8_2_;
  auVar262._4_2_ = auVar285._10_2_;
  auVar262._6_2_ = uStack_46e;
  auVar262._8_2_ = auVar285._12_2_;
  auVar262._10_2_ = uStack_46c;
  auVar262._12_2_ = auVar285._14_2_;
  auVar262._14_2_ = uStack_46a;
  auVar245 = pmaddwd(auVar203,auVar131);
  auVar47 = pmaddwd(auVar262,auVar131);
  auVar286._0_4_ = auVar245._0_4_ + 0x800 >> 0xc;
  auVar286._4_4_ = auVar245._4_4_ + 0x800 >> 0xc;
  auVar286._8_4_ = auVar245._8_4_ + 0x800 >> 0xc;
  auVar286._12_4_ = auVar245._12_4_ + 0x800 >> 0xc;
  auVar19._0_4_ = auVar47._0_4_ + 0x800 >> 0xc;
  auVar19._4_4_ = auVar47._4_4_ + 0x800 >> 0xc;
  auVar19._8_4_ = auVar47._8_4_ + 0x800 >> 0xc;
  auVar19._12_4_ = auVar47._12_4_ + 0x800 >> 0xc;
  auVar47 = packssdw(auVar286,auVar19);
  auVar245 = pmaddwd(auVar203,auVar102);
  auVar49 = pmaddwd(auVar262,auVar102);
  auVar207._0_4_ = auVar245._0_4_ + 0x800 >> 0xc;
  auVar207._4_4_ = auVar245._4_4_ + 0x800 >> 0xc;
  auVar207._8_4_ = auVar245._8_4_ + 0x800 >> 0xc;
  auVar207._12_4_ = auVar245._12_4_ + 0x800 >> 0xc;
  auVar263._0_4_ = auVar49._0_4_ + 0x800 >> 0xc;
  auVar263._4_4_ = auVar49._4_4_ + 0x800 >> 0xc;
  auVar263._8_4_ = auVar49._8_4_ + 0x800 >> 0xc;
  auVar263._12_4_ = auVar49._12_4_ + 0x800 >> 0xc;
  auVar291 = packssdw(auVar207,auVar263);
  local_6d8 = auVar247._0_2_;
  uStack_6d6 = auVar247._2_2_;
  uStack_6d4 = auVar247._4_2_;
  uStack_6d2 = auVar247._6_2_;
  uStack_6d0 = auVar247._8_2_;
  uStack_6ce = auVar247._10_2_;
  uStack_6cc = auVar247._12_2_;
  uStack_6ca = auVar247._14_2_;
  auVar211._0_12_ = auVar55._0_12_;
  auVar211._12_2_ = auVar55._6_2_;
  auVar211._14_2_ = uStack_6d2;
  auVar210._12_4_ = auVar211._12_4_;
  auVar210._0_10_ = auVar55._0_10_;
  auVar210._10_2_ = uStack_6d4;
  auVar209._10_6_ = auVar210._10_6_;
  auVar209._0_8_ = auVar55._0_8_;
  auVar209._8_2_ = auVar55._4_2_;
  auVar208._8_8_ = auVar209._8_8_;
  auVar208._6_2_ = uStack_6d6;
  auVar208._4_2_ = auVar55._2_2_;
  auVar208._0_2_ = auVar55._0_2_;
  auVar208._2_2_ = local_6d8;
  auVar138._2_2_ = uStack_6d0;
  auVar138._0_2_ = auVar55._8_2_;
  auVar138._4_2_ = auVar55._10_2_;
  auVar138._6_2_ = uStack_6ce;
  auVar138._8_2_ = auVar55._12_2_;
  auVar138._10_2_ = uStack_6cc;
  auVar138._12_2_ = auVar55._14_2_;
  auVar138._14_2_ = uStack_6ca;
  auVar245 = pmaddwd(auVar208,auVar131);
  auVar49 = pmaddwd(auVar131,auVar138);
  auVar55 = pmaddwd(auVar208,auVar102);
  auVar51 = pmaddwd(auVar138,auVar102);
  auVar113._0_4_ = auVar245._0_4_ + 0x800 >> 0xc;
  auVar113._4_4_ = auVar245._4_4_ + 0x800 >> 0xc;
  auVar113._8_4_ = auVar245._8_4_ + 0x800 >> 0xc;
  auVar113._12_4_ = auVar245._12_4_ + 0x800 >> 0xc;
  auVar76._0_4_ = auVar49._0_4_ + 0x800 >> 0xc;
  auVar76._4_4_ = auVar49._4_4_ + 0x800 >> 0xc;
  auVar76._8_4_ = auVar49._8_4_ + 0x800 >> 0xc;
  auVar76._12_4_ = auVar49._12_4_ + 0x800 >> 0xc;
  auVar49 = packssdw(auVar113,auVar76);
  auVar212._0_4_ = auVar55._0_4_ + 0x800 >> 0xc;
  auVar212._4_4_ = auVar55._4_4_ + 0x800 >> 0xc;
  auVar212._8_4_ = auVar55._8_4_ + 0x800 >> 0xc;
  auVar212._12_4_ = auVar55._12_4_ + 0x800 >> 0xc;
  auVar139._0_4_ = auVar51._0_4_ + 0x800 >> 0xc;
  auVar139._4_4_ = auVar51._4_4_ + 0x800 >> 0xc;
  auVar139._8_4_ = auVar51._8_4_ + 0x800 >> 0xc;
  auVar139._12_4_ = auVar51._12_4_ + 0x800 >> 0xc;
  auVar289 = packssdw(auVar212,auVar139);
  local_4f8 = auVar7._0_2_;
  uStack_4f6 = auVar7._2_2_;
  uStack_4f4 = auVar7._4_2_;
  uStack_4f2 = auVar7._6_2_;
  uStack_4f0 = auVar7._8_2_;
  uStack_4ee = auVar7._10_2_;
  uStack_4ec = auVar7._12_2_;
  uStack_4ea = auVar7._14_2_;
  auVar80._0_12_ = auVar179._0_12_;
  auVar80._12_2_ = auVar179._6_2_;
  auVar80._14_2_ = uStack_4f2;
  auVar79._12_4_ = auVar80._12_4_;
  auVar79._0_10_ = auVar179._0_10_;
  auVar79._10_2_ = uStack_4f4;
  auVar78._10_6_ = auVar79._10_6_;
  auVar78._0_8_ = auVar179._0_8_;
  auVar78._8_2_ = auVar179._4_2_;
  auVar77._8_8_ = auVar78._8_8_;
  auVar77._6_2_ = uStack_4f6;
  auVar77._4_2_ = auVar179._2_2_;
  auVar77._0_2_ = auVar179._0_2_;
  auVar77._2_2_ = local_4f8;
  auVar264._2_2_ = uStack_4f0;
  auVar264._0_2_ = auVar179._8_2_;
  auVar264._4_2_ = auVar179._10_2_;
  auVar264._6_2_ = uStack_4ee;
  auVar264._8_2_ = auVar179._12_2_;
  auVar264._10_2_ = uStack_4ec;
  auVar264._12_2_ = auVar179._14_2_;
  auVar264._14_2_ = uStack_4ea;
  auVar20._8_4_ = 0xb50f4b0;
  auVar20._0_8_ = 0xb50f4b00b50f4b0;
  auVar20._12_4_ = 0xb50f4b0;
  auVar51 = pmaddwd(auVar77,auVar20);
  auVar245 = pmaddwd(auVar264,auVar20);
  auVar140._0_4_ = auVar51._0_4_ + 0x800 >> 0xc;
  auVar140._4_4_ = auVar51._4_4_ + 0x800 >> 0xc;
  auVar140._8_4_ = auVar51._8_4_ + 0x800 >> 0xc;
  auVar140._12_4_ = auVar51._12_4_ + 0x800 >> 0xc;
  auVar114._0_4_ = auVar245._0_4_ + 0x800 >> 0xc;
  auVar114._4_4_ = auVar245._4_4_ + 0x800 >> 0xc;
  auVar114._8_4_ = auVar245._8_4_ + 0x800 >> 0xc;
  auVar114._12_4_ = auVar245._12_4_ + 0x800 >> 0xc;
  auVar141 = packssdw(auVar140,auVar114);
  auVar245 = pshuflw(ZEXT416(0x5a80),ZEXT416(0x5a80),0);
  auVar116._0_4_ = auVar245._0_4_;
  auVar116._4_4_ = auVar116._0_4_;
  auVar116._8_4_ = auVar116._0_4_;
  auVar116._12_4_ = auVar116._0_4_;
  auVar245._8_8_ = lStack_430;
  auVar245._0_8_ = local_438;
  auVar245 = pmulhrsw(auVar116,auVar245);
  auVar21._8_4_ = 0xb500b50;
  auVar21._0_8_ = 0xb500b500b500b50;
  auVar21._12_4_ = 0xb500b50;
  auVar55 = pmaddwd(auVar77,auVar21);
  auVar51 = pmaddwd(auVar264,auVar21);
  auVar81._0_4_ = auVar55._0_4_ + 0x800 >> 0xc;
  auVar81._4_4_ = auVar55._4_4_ + 0x800 >> 0xc;
  auVar81._8_4_ = auVar55._8_4_ + 0x800 >> 0xc;
  auVar81._12_4_ = auVar55._12_4_ + 0x800 >> 0xc;
  auVar358._0_4_ = auVar51._0_4_ + 0x800 >> 0xc;
  auVar358._4_4_ = auVar51._4_4_ + 0x800 >> 0xc;
  auVar358._8_4_ = auVar51._8_4_ + 0x800 >> 0xc;
  auVar358._12_4_ = auVar51._12_4_ + 0x800 >> 0xc;
  auVar82 = packssdw(auVar81,auVar358);
  auVar51 = paddsw(auVar293,auVar295);
  auVar103 = psubsw(auVar293,auVar295);
  auVar135 = psubsw(local_348,local_378);
  auVar55 = paddsw(local_348,local_378);
  auVar213 = psubsw(auVar347,auVar353);
  auVar177 = paddsw(auVar353,auVar347);
  local_468 = auVar228._0_2_;
  uStack_466 = auVar228._2_2_;
  uStack_464 = auVar228._4_2_;
  uStack_462 = auVar228._6_2_;
  uStack_460 = auVar228._8_2_;
  uStack_45e = auVar228._10_2_;
  uStack_45c = auVar228._12_2_;
  uStack_45a = auVar228._14_2_;
  auVar268._0_12_ = auVar326._0_12_;
  auVar268._12_2_ = auVar326._6_2_;
  auVar268._14_2_ = uStack_462;
  auVar267._12_4_ = auVar268._12_4_;
  auVar267._0_10_ = auVar326._0_10_;
  auVar267._10_2_ = uStack_464;
  auVar266._10_6_ = auVar267._10_6_;
  auVar266._0_8_ = auVar326._0_8_;
  auVar266._8_2_ = auVar326._4_2_;
  auVar265._8_8_ = auVar266._8_8_;
  auVar265._6_2_ = uStack_466;
  auVar265._4_2_ = auVar326._2_2_;
  auVar265._0_2_ = auVar326._0_2_;
  auVar265._2_2_ = local_468;
  auVar22._2_2_ = uStack_460;
  auVar22._0_2_ = auVar326._8_2_;
  auVar22._4_2_ = auVar326._10_2_;
  auVar22._6_2_ = uStack_45e;
  auVar22._8_2_ = auVar326._12_2_;
  auVar22._10_2_ = uStack_45c;
  auVar22._12_2_ = auVar326._14_2_;
  auVar22._14_2_ = uStack_45a;
  auVar247 = pmaddwd(auVar265,auVar325);
  auVar228 = pmaddwd(auVar22,auVar325);
  auVar214._0_4_ = auVar247._0_4_ + 0x800 >> 0xc;
  auVar214._4_4_ = auVar247._4_4_ + 0x800 >> 0xc;
  auVar214._8_4_ = auVar247._8_4_ + 0x800 >> 0xc;
  auVar214._12_4_ = auVar247._12_4_ + 0x800 >> 0xc;
  auVar293._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar293._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar293._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar293._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar215 = packssdw(auVar214,auVar293);
  auVar247 = pmaddwd(auVar265,auVar194);
  auVar228 = pmaddwd(auVar22,auVar194);
  auVar269._0_4_ = auVar247._0_4_ + 0x800 >> 0xc;
  auVar269._4_4_ = auVar247._4_4_ + 0x800 >> 0xc;
  auVar269._8_4_ = auVar247._8_4_ + 0x800 >> 0xc;
  auVar269._12_4_ = auVar247._12_4_ + 0x800 >> 0xc;
  auVar23._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar23._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar23._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar23._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar270 = packssdw(auVar269,auVar23);
  local_458 = auVar422._0_2_;
  uStack_456 = auVar422._2_2_;
  uStack_454 = auVar422._4_2_;
  uStack_452 = auVar422._6_2_;
  uStack_450 = auVar422._8_2_;
  uStack_44e = auVar422._10_2_;
  uStack_44c = auVar422._12_2_;
  uStack_44a = auVar422._14_2_;
  auVar313._0_12_ = auVar231._0_12_;
  auVar313._12_2_ = auVar231._6_2_;
  auVar313._14_2_ = uStack_452;
  auVar312._12_4_ = auVar313._12_4_;
  auVar312._0_10_ = auVar231._0_10_;
  auVar312._10_2_ = uStack_454;
  auVar311._10_6_ = auVar312._10_6_;
  auVar311._0_8_ = auVar231._0_8_;
  auVar311._8_2_ = auVar231._4_2_;
  auVar310._8_8_ = auVar311._8_8_;
  auVar310._6_2_ = uStack_456;
  auVar310._4_2_ = auVar231._2_2_;
  auVar310._0_2_ = auVar231._0_2_;
  auVar310._2_2_ = local_458;
  auVar232._2_2_ = uStack_450;
  auVar232._0_2_ = auVar231._8_2_;
  auVar232._4_2_ = auVar231._10_2_;
  auVar232._6_2_ = uStack_44e;
  auVar232._8_2_ = auVar231._12_2_;
  auVar232._10_2_ = uStack_44c;
  auVar232._12_2_ = auVar231._14_2_;
  auVar232._14_2_ = uStack_44a;
  auVar247 = pmaddwd(auVar310,auVar325);
  auVar228 = pmaddwd(auVar232,auVar325);
  auVar24._0_4_ = auVar247._0_4_ + 0x800 >> 0xc;
  auVar24._4_4_ = auVar247._4_4_ + 0x800 >> 0xc;
  auVar24._8_4_ = auVar247._8_4_ + 0x800 >> 0xc;
  auVar24._12_4_ = auVar247._12_4_ + 0x800 >> 0xc;
  auVar295._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar295._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar295._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar295._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar181 = packssdw(auVar24,auVar295);
  auVar247 = pmaddwd(auVar310,auVar194);
  auVar228 = pmaddwd(auVar232,auVar194);
  auVar314._0_4_ = auVar247._0_4_ + 0x800 >> 0xc;
  auVar314._4_4_ = auVar247._4_4_ + 0x800 >> 0xc;
  auVar314._8_4_ = auVar247._8_4_ + 0x800 >> 0xc;
  auVar314._12_4_ = auVar247._12_4_ + 0x800 >> 0xc;
  auVar233._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar233._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar233._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar233._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar385 = packssdw(auVar314,auVar233);
  local_4b8 = auVar258._0_2_;
  uStack_4b6 = auVar258._2_2_;
  uStack_4b4 = auVar258._4_2_;
  uStack_4b2 = auVar258._6_2_;
  uStack_4b0 = auVar258._8_2_;
  uStack_4ae = auVar258._10_2_;
  uStack_4ac = auVar258._12_2_;
  uStack_4aa = auVar258._14_2_;
  auVar28._0_12_ = auVar354._0_12_;
  auVar28._12_2_ = auVar354._6_2_;
  auVar28._14_2_ = uStack_4b2;
  auVar27._12_4_ = auVar28._12_4_;
  auVar27._0_10_ = auVar354._0_10_;
  auVar27._10_2_ = uStack_4b4;
  auVar26._10_6_ = auVar27._10_6_;
  auVar26._0_8_ = auVar354._0_8_;
  auVar26._8_2_ = auVar354._4_2_;
  auVar25._8_8_ = auVar26._8_8_;
  auVar25._6_2_ = uStack_4b6;
  auVar25._4_2_ = auVar354._2_2_;
  auVar25._0_2_ = auVar354._0_2_;
  auVar25._2_2_ = local_4b8;
  auVar355._2_2_ = uStack_4b0;
  auVar355._0_2_ = auVar354._8_2_;
  auVar355._4_2_ = auVar354._10_2_;
  auVar355._6_2_ = uStack_4ae;
  auVar355._8_2_ = auVar354._12_2_;
  auVar355._10_2_ = uStack_4ac;
  auVar355._12_2_ = auVar354._14_2_;
  auVar355._14_2_ = uStack_4aa;
  auVar247 = pmaddwd(auVar25,auVar70);
  auVar228 = pmaddwd(auVar355,auVar70);
  auVar216._0_4_ = auVar247._0_4_ + 0x800 >> 0xc;
  auVar216._4_4_ = auVar247._4_4_ + 0x800 >> 0xc;
  auVar216._8_4_ = auVar247._8_4_ + 0x800 >> 0xc;
  auVar216._12_4_ = auVar247._12_4_ + 0x800 >> 0xc;
  auVar326._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar326._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar326._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar326._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar217 = packssdw(auVar216,auVar326);
  auVar228 = pmaddwd(auVar25,auVar325);
  auVar247 = pmaddwd(auVar355,auVar325);
  auVar29._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar29._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar29._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar29._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar356._0_4_ = auVar247._0_4_ + 0x800 >> 0xc;
  auVar356._4_4_ = auVar247._4_4_ + 0x800 >> 0xc;
  auVar356._8_4_ = auVar247._8_4_ + 0x800 >> 0xc;
  auVar356._12_4_ = auVar247._12_4_ + 0x800 >> 0xc;
  auVar422 = packssdw(auVar29,auVar356);
  local_848 = auVar74._0_2_;
  uStack_846 = auVar74._2_2_;
  uStack_844 = auVar74._4_2_;
  uStack_842 = auVar74._6_2_;
  uStack_840 = auVar74._8_2_;
  uStack_83e = auVar74._10_2_;
  uStack_83c = auVar74._12_2_;
  uStack_83a = auVar74._14_2_;
  auVar33._0_12_ = auVar327._0_12_;
  auVar33._12_2_ = auVar327._6_2_;
  auVar33._14_2_ = uStack_842;
  auVar32._12_4_ = auVar33._12_4_;
  auVar32._0_10_ = auVar327._0_10_;
  auVar32._10_2_ = uStack_844;
  auVar31._10_6_ = auVar32._10_6_;
  auVar31._0_8_ = auVar327._0_8_;
  auVar31._8_2_ = auVar327._4_2_;
  auVar30._8_8_ = auVar31._8_8_;
  auVar30._6_2_ = uStack_846;
  auVar30._4_2_ = auVar327._2_2_;
  auVar30._0_2_ = auVar327._0_2_;
  auVar30._2_2_ = local_848;
  auVar328._2_2_ = uStack_840;
  auVar328._0_2_ = auVar327._8_2_;
  auVar328._4_2_ = auVar327._10_2_;
  auVar328._6_2_ = uStack_83e;
  auVar328._8_2_ = auVar327._12_2_;
  auVar328._10_2_ = uStack_83c;
  auVar328._12_2_ = auVar327._14_2_;
  auVar328._14_2_ = uStack_83a;
  auVar247 = pmaddwd(auVar30,auVar70);
  auVar228 = pmaddwd(auVar328,auVar70);
  auVar357._0_4_ = auVar247._0_4_ + 0x800 >> 0xc;
  auVar357._4_4_ = auVar247._4_4_ + 0x800 >> 0xc;
  auVar357._8_4_ = auVar247._8_4_ + 0x800 >> 0xc;
  auVar357._12_4_ = auVar247._12_4_ + 0x800 >> 0xc;
  auVar327._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar327._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar327._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar327._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar358 = packssdw(auVar357,auVar327);
  auVar228 = pmaddwd(auVar30,auVar325);
  auVar247 = pmaddwd(auVar328,auVar325);
  auVar34._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar34._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar34._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar34._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar329._0_4_ = auVar247._0_4_ + 0x800 >> 0xc;
  auVar329._4_4_ = auVar247._4_4_ + 0x800 >> 0xc;
  auVar329._8_4_ = auVar247._8_4_ + 0x800 >> 0xc;
  auVar329._12_4_ = auVar247._12_4_ + 0x800 >> 0xc;
  auVar285 = packssdw(auVar34,auVar329);
  auVar347 = paddsw(auVar13,auVar132);
  auVar228 = psubsw(auVar13,auVar132);
  auVar353 = paddsw(auVar66,auVar133);
  auVar247 = psubsw(auVar66,auVar133);
  auVar74 = paddsw(auVar260,auVar288);
  auVar132 = psubsw(auVar260,auVar288);
  auVar288 = paddsw(auVar284,auVar255);
  auVar133 = psubsw(auVar284,auVar255);
  auVar260 = psubsw(auVar183,auVar134);
  auVar231 = paddsw(auVar183,auVar134);
  auVar183 = psubsw(auVar184,auVar182);
  auVar258 = paddsw(auVar184,auVar182);
  auVar255 = psubsw(auVar49,auVar4);
  auVar4 = paddsw(auVar49,auVar4);
  auVar284 = psubsw(auVar47,auVar400);
  auVar47 = paddsw(auVar47,auVar400);
  auVar354 = paddsw(auVar185,auVar187);
  auVar49 = psubsw(auVar185,auVar187);
  auVar296 = paddsw(auVar186,auVar188);
  auVar187 = psubsw(auVar186,auVar188);
  auVar188 = paddsw(auVar289,auVar407);
  auVar400 = psubsw(auVar289,auVar407);
  auVar289 = paddsw(auVar291,auVar290);
  auVar407 = psubsw(auVar291,auVar290);
  auVar287 = psubsw(auVar191,auVar189);
  auVar290 = paddsw(auVar191,auVar189);
  auVar286 = psubsw(auVar192,auVar190);
  auVar191 = paddsw(auVar192,auVar190);
  auVar113 = psubsw(auVar370,auVar3);
  auVar3 = paddsw(auVar3,auVar370);
  auVar114 = psubsw(auVar376,auVar2);
  auVar2 = paddsw(auVar2,auVar376);
  auVar35 = paddsw(auVar245,auVar7);
  auVar36 = psubsw(auVar245,auVar7);
  auVar192 = paddsw(auVar245,auVar82);
  auVar82 = psubsw(auVar245,auVar82);
  auVar291 = paddsw(auVar245,auVar141);
  auVar13 = psubsw(auVar245,auVar141);
  auVar141 = paddsw(auVar245,auVar179);
  auVar370 = psubsw(auVar245,auVar179);
  local_4c8 = auVar213._0_2_;
  uStack_4c6 = auVar213._2_2_;
  uStack_4c4 = auVar213._4_2_;
  uStack_4c2 = auVar213._6_2_;
  uStack_4c0 = auVar213._8_2_;
  uStack_4be = auVar213._10_2_;
  uStack_4bc = auVar213._12_2_;
  uStack_4ba = auVar213._14_2_;
  auVar333._0_12_ = auVar103._0_12_;
  auVar333._12_2_ = auVar103._6_2_;
  auVar333._14_2_ = uStack_4c2;
  auVar332._12_4_ = auVar333._12_4_;
  auVar332._0_10_ = auVar103._0_10_;
  auVar332._10_2_ = uStack_4c4;
  auVar331._10_6_ = auVar332._10_6_;
  auVar331._0_8_ = auVar103._0_8_;
  auVar331._8_2_ = auVar103._4_2_;
  auVar330._8_8_ = auVar331._8_8_;
  auVar330._6_2_ = uStack_4c6;
  auVar330._4_2_ = auVar103._2_2_;
  auVar330._0_2_ = auVar103._0_2_;
  auVar330._2_2_ = local_4c8;
  auVar297._2_2_ = uStack_4c0;
  auVar297._0_2_ = auVar103._8_2_;
  auVar297._4_2_ = auVar103._10_2_;
  auVar297._6_2_ = uStack_4be;
  auVar297._8_2_ = auVar103._12_2_;
  auVar297._10_2_ = uStack_4bc;
  auVar297._12_2_ = auVar103._14_2_;
  auVar297._14_2_ = uStack_4ba;
  auVar103 = pmaddwd(auVar330,auVar20);
  auVar245 = pmaddwd(auVar297,auVar20);
  auVar115._0_4_ = auVar103._0_4_ + 0x800 >> 0xc;
  auVar115._4_4_ = auVar103._4_4_ + 0x800 >> 0xc;
  auVar115._8_4_ = auVar103._8_4_ + 0x800 >> 0xc;
  auVar115._12_4_ = auVar103._12_4_ + 0x800 >> 0xc;
  auVar37._0_4_ = auVar245._0_4_ + 0x800 >> 0xc;
  auVar37._4_4_ = auVar245._4_4_ + 0x800 >> 0xc;
  auVar37._8_4_ = auVar245._8_4_ + 0x800 >> 0xc;
  auVar37._12_4_ = auVar245._12_4_ + 0x800 >> 0xc;
  auVar116 = packssdw(auVar115,auVar37);
  auVar103 = pmaddwd(auVar330,auVar21);
  auVar245 = pmaddwd(auVar297,auVar21);
  auVar334._0_4_ = auVar103._0_4_ + 0x800 >> 0xc;
  auVar334._4_4_ = auVar103._4_4_ + 0x800 >> 0xc;
  auVar334._8_4_ = auVar103._8_4_ + 0x800 >> 0xc;
  auVar334._12_4_ = auVar103._12_4_ + 0x800 >> 0xc;
  auVar298._0_4_ = auVar245._0_4_ + 0x800 >> 0xc;
  auVar298._4_4_ = auVar245._4_4_ + 0x800 >> 0xc;
  auVar298._8_4_ = auVar245._8_4_ + 0x800 >> 0xc;
  auVar298._12_4_ = auVar245._12_4_ + 0x800 >> 0xc;
  auVar190 = packssdw(auVar334,auVar298);
  local_588 = auVar135._0_2_;
  uStack_586 = auVar135._2_2_;
  uStack_584 = auVar135._4_2_;
  uStack_582 = auVar135._6_2_;
  uStack_580 = auVar135._8_2_;
  uStack_57e = auVar135._10_2_;
  uStack_57c = auVar135._12_2_;
  uStack_57a = auVar135._14_2_;
  auVar41._0_12_ = auVar364._0_12_;
  auVar41._12_2_ = auVar364._6_2_;
  auVar41._14_2_ = uStack_582;
  auVar40._12_4_ = auVar41._12_4_;
  auVar40._0_10_ = auVar364._0_10_;
  auVar40._10_2_ = uStack_584;
  auVar39._10_6_ = auVar40._10_6_;
  auVar39._0_8_ = auVar364._0_8_;
  auVar39._8_2_ = auVar364._4_2_;
  auVar38._8_8_ = auVar39._8_8_;
  auVar38._6_2_ = uStack_586;
  auVar38._4_2_ = auVar364._2_2_;
  auVar38._0_2_ = auVar364._0_2_;
  auVar38._2_2_ = local_588;
  auVar408._2_2_ = uStack_580;
  auVar408._0_2_ = auVar364._8_2_;
  auVar408._4_2_ = auVar364._10_2_;
  auVar408._6_2_ = uStack_57e;
  auVar408._8_2_ = auVar364._12_2_;
  auVar408._10_2_ = uStack_57c;
  auVar408._12_2_ = auVar364._14_2_;
  auVar408._14_2_ = uStack_57a;
  auVar103 = pmaddwd(auVar38,auVar20);
  auVar245 = pmaddwd(auVar408,auVar20);
  auVar299._0_4_ = auVar103._0_4_ + 0x800 >> 0xc;
  auVar299._4_4_ = auVar103._4_4_ + 0x800 >> 0xc;
  auVar299._8_4_ = auVar103._8_4_ + 0x800 >> 0xc;
  auVar299._12_4_ = auVar103._12_4_ + 0x800 >> 0xc;
  auVar142._0_4_ = auVar245._0_4_ + 0x800 >> 0xc;
  auVar142._4_4_ = auVar245._4_4_ + 0x800 >> 0xc;
  auVar142._8_4_ = auVar245._8_4_ + 0x800 >> 0xc;
  auVar142._12_4_ = auVar245._12_4_ + 0x800 >> 0xc;
  auVar189 = packssdw(auVar299,auVar142);
  auVar245 = pmaddwd(auVar38,auVar21);
  auVar103 = pmaddwd(auVar408,auVar21);
  auVar42._0_4_ = auVar245._0_4_ + 0x800 >> 0xc;
  auVar42._4_4_ = auVar245._4_4_ + 0x800 >> 0xc;
  auVar42._8_4_ = auVar245._8_4_ + 0x800 >> 0xc;
  auVar42._12_4_ = auVar245._12_4_ + 0x800 >> 0xc;
  auVar409._0_4_ = auVar103._0_4_ + 0x800 >> 0xc;
  auVar409._4_4_ = auVar103._4_4_ + 0x800 >> 0xc;
  auVar409._8_4_ = auVar103._8_4_ + 0x800 >> 0xc;
  auVar409._12_4_ = auVar103._12_4_ + 0x800 >> 0xc;
  auVar213 = packssdw(auVar42,auVar409);
  auVar293 = paddsw(auVar71,auVar72);
  auVar410 = psubsw(auVar71,auVar72);
  auVar295 = paddsw(auVar197,auVar257);
  auVar245 = psubsw(auVar197,auVar257);
  auVar326 = paddsw(auVar215,auVar358);
  auVar103 = psubsw(auVar215,auVar358);
  auVar327 = paddsw(auVar181,auVar217);
  auVar135 = psubsw(auVar181,auVar217);
  auVar358 = psubsw(auVar75,auVar73);
  auVar215 = paddsw(auVar75,auVar73);
  auVar181 = psubsw(auVar401,auVar198);
  auVar217 = paddsw(auVar401,auVar198);
  auVar66 = psubsw(auVar270,auVar285);
  auVar270 = paddsw(auVar285,auVar270);
  auVar186 = psubsw(auVar385,auVar422);
  auVar385 = paddsw(auVar422,auVar385);
  local_578 = auVar114._0_2_;
  uStack_576 = auVar114._2_2_;
  uStack_574 = auVar114._4_2_;
  uStack_572 = auVar114._6_2_;
  uStack_570 = auVar114._8_2_;
  uStack_56e = auVar114._10_2_;
  uStack_56c = auVar114._12_2_;
  uStack_56a = auVar114._14_2_;
  auVar274._0_12_ = auVar133._0_12_;
  auVar274._12_2_ = auVar133._6_2_;
  auVar274._14_2_ = uStack_572;
  auVar273._12_4_ = auVar274._12_4_;
  auVar273._0_10_ = auVar133._0_10_;
  auVar273._10_2_ = uStack_574;
  auVar272._10_6_ = auVar273._10_6_;
  auVar272._0_8_ = auVar133._0_8_;
  auVar272._8_2_ = auVar133._4_2_;
  auVar271._8_8_ = auVar272._8_8_;
  auVar271._6_2_ = uStack_576;
  auVar271._4_2_ = auVar133._2_2_;
  auVar271._0_2_ = auVar133._0_2_;
  auVar271._2_2_ = local_578;
  auVar424._2_2_ = uStack_570;
  auVar424._0_2_ = auVar133._8_2_;
  auVar424._4_2_ = auVar133._10_2_;
  auVar424._6_2_ = uStack_56e;
  auVar424._8_2_ = auVar133._12_2_;
  auVar424._10_2_ = uStack_56c;
  auVar424._12_2_ = auVar133._14_2_;
  auVar424._14_2_ = uStack_56a;
  auVar285 = pmaddwd(auVar271,auVar325);
  auVar422 = pmaddwd(auVar424,auVar325);
  auVar143._0_4_ = auVar285._0_4_ + 0x800 >> 0xc;
  auVar143._4_4_ = auVar285._4_4_ + 0x800 >> 0xc;
  auVar143._8_4_ = auVar285._8_4_ + 0x800 >> 0xc;
  auVar143._12_4_ = auVar285._12_4_ + 0x800 >> 0xc;
  auVar83._0_4_ = auVar422._0_4_ + 0x800 >> 0xc;
  auVar83._4_4_ = auVar422._4_4_ + 0x800 >> 0xc;
  auVar83._8_4_ = auVar422._8_4_ + 0x800 >> 0xc;
  auVar83._12_4_ = auVar422._12_4_ + 0x800 >> 0xc;
  auVar114 = packssdw(auVar143,auVar83);
  auVar422 = pmaddwd(auVar271,auVar194);
  auVar285 = pmaddwd(auVar424,auVar194);
  auVar275._0_4_ = auVar422._0_4_ + 0x800 >> 0xc;
  auVar275._4_4_ = auVar422._4_4_ + 0x800 >> 0xc;
  auVar275._8_4_ = auVar422._8_4_ + 0x800 >> 0xc;
  auVar275._12_4_ = auVar422._12_4_ + 0x800 >> 0xc;
  auVar425._0_4_ = auVar285._0_4_ + 0x800 >> 0xc;
  auVar425._4_4_ = auVar285._4_4_ + 0x800 >> 0xc;
  auVar425._8_4_ = auVar285._8_4_ + 0x800 >> 0xc;
  auVar425._12_4_ = auVar285._12_4_ + 0x800 >> 0xc;
  auVar198 = packssdw(auVar275,auVar425);
  local_6b8 = auVar113._0_2_;
  uStack_6b6 = auVar113._2_2_;
  uStack_6b4 = auVar113._4_2_;
  uStack_6b2 = auVar113._6_2_;
  uStack_6b0 = auVar113._8_2_;
  uStack_6ae = auVar113._10_2_;
  uStack_6ac = auVar113._12_2_;
  uStack_6aa = auVar113._14_2_;
  auVar318._0_12_ = auVar132._0_12_;
  auVar318._12_2_ = auVar132._6_2_;
  auVar318._14_2_ = uStack_6b2;
  auVar317._12_4_ = auVar318._12_4_;
  auVar317._0_10_ = auVar132._0_10_;
  auVar317._10_2_ = uStack_6b4;
  auVar316._10_6_ = auVar317._10_6_;
  auVar316._0_8_ = auVar132._0_8_;
  auVar316._8_2_ = auVar132._4_2_;
  auVar315._8_8_ = auVar316._8_8_;
  auVar315._6_2_ = uStack_6b6;
  auVar315._4_2_ = auVar132._2_2_;
  auVar315._0_2_ = auVar132._0_2_;
  auVar315._2_2_ = local_6b8;
  auVar276._2_2_ = uStack_6b0;
  auVar276._0_2_ = auVar132._8_2_;
  auVar276._4_2_ = auVar132._10_2_;
  auVar276._6_2_ = uStack_6ae;
  auVar276._8_2_ = auVar132._12_2_;
  auVar276._10_2_ = uStack_6ac;
  auVar276._12_2_ = auVar132._14_2_;
  auVar276._14_2_ = uStack_6aa;
  auVar422 = pmaddwd(auVar315,auVar325);
  auVar285 = pmaddwd(auVar276,auVar325);
  auVar7._0_4_ = auVar422._0_4_ + 0x800 >> 0xc;
  auVar7._4_4_ = auVar422._4_4_ + 0x800 >> 0xc;
  auVar7._8_4_ = auVar422._8_4_ + 0x800 >> 0xc;
  auVar7._12_4_ = auVar422._12_4_ + 0x800 >> 0xc;
  auVar84._0_4_ = auVar285._0_4_ + 0x800 >> 0xc;
  auVar84._4_4_ = auVar285._4_4_ + 0x800 >> 0xc;
  auVar84._8_4_ = auVar285._8_4_ + 0x800 >> 0xc;
  auVar84._12_4_ = auVar285._12_4_ + 0x800 >> 0xc;
  auVar422 = packssdw(auVar7,auVar84);
  auVar132 = pmaddwd(auVar315,auVar194);
  auVar285 = pmaddwd(auVar276,auVar194);
  auVar319._0_4_ = auVar132._0_4_ + 0x800 >> 0xc;
  auVar319._4_4_ = auVar132._4_4_ + 0x800 >> 0xc;
  auVar319._8_4_ = auVar132._8_4_ + 0x800 >> 0xc;
  auVar319._12_4_ = auVar132._12_4_ + 0x800 >> 0xc;
  auVar277._0_4_ = auVar285._0_4_ + 0x800 >> 0xc;
  auVar277._4_4_ = auVar285._4_4_ + 0x800 >> 0xc;
  auVar277._8_4_ = auVar285._8_4_ + 0x800 >> 0xc;
  auVar277._12_4_ = auVar285._12_4_ + 0x800 >> 0xc;
  auVar257 = packssdw(auVar319,auVar277);
  local_798 = auVar286._0_2_;
  uStack_796 = auVar286._2_2_;
  uStack_794 = auVar286._4_2_;
  uStack_792 = auVar286._6_2_;
  uStack_790 = auVar286._8_2_;
  uStack_78e = auVar286._10_2_;
  uStack_78c = auVar286._12_2_;
  uStack_78a = auVar286._14_2_;
  auVar323._0_12_ = auVar247._0_12_;
  auVar323._12_2_ = auVar247._6_2_;
  auVar323._14_2_ = uStack_792;
  auVar322._12_4_ = auVar323._12_4_;
  auVar322._0_10_ = auVar247._0_10_;
  auVar322._10_2_ = uStack_794;
  auVar321._10_6_ = auVar322._10_6_;
  auVar321._0_8_ = auVar247._0_8_;
  auVar321._8_2_ = auVar247._4_2_;
  auVar320._8_8_ = auVar321._8_8_;
  auVar320._6_2_ = uStack_796;
  auVar320._4_2_ = auVar247._2_2_;
  auVar320._0_2_ = auVar247._0_2_;
  auVar320._2_2_ = local_798;
  auVar117._2_2_ = uStack_790;
  auVar117._0_2_ = auVar247._8_2_;
  auVar117._4_2_ = auVar247._10_2_;
  auVar117._6_2_ = uStack_78e;
  auVar117._8_2_ = auVar247._12_2_;
  auVar117._10_2_ = uStack_78c;
  auVar117._12_2_ = auVar247._14_2_;
  auVar117._14_2_ = uStack_78a;
  auVar247 = pmaddwd(auVar320,auVar325);
  auVar285 = pmaddwd(auVar117,auVar325);
  auVar71._0_4_ = auVar247._0_4_ + 0x800 >> 0xc;
  auVar71._4_4_ = auVar247._4_4_ + 0x800 >> 0xc;
  auVar71._8_4_ = auVar247._8_4_ + 0x800 >> 0xc;
  auVar71._12_4_ = auVar247._12_4_ + 0x800 >> 0xc;
  auVar85._0_4_ = auVar285._0_4_ + 0x800 >> 0xc;
  auVar85._4_4_ = auVar285._4_4_ + 0x800 >> 0xc;
  auVar85._8_4_ = auVar285._8_4_ + 0x800 >> 0xc;
  auVar85._12_4_ = auVar285._12_4_ + 0x800 >> 0xc;
  auVar247 = packssdw(auVar71,auVar85);
  auVar132 = pmaddwd(auVar320,auVar194);
  auVar285 = pmaddwd(auVar117,auVar194);
  auVar324._0_4_ = auVar132._0_4_ + 0x800 >> 0xc;
  auVar324._4_4_ = auVar132._4_4_ + 0x800 >> 0xc;
  auVar324._8_4_ = auVar132._8_4_ + 0x800 >> 0xc;
  auVar324._12_4_ = auVar132._12_4_ + 0x800 >> 0xc;
  auVar118._0_4_ = auVar285._0_4_ + 0x800 >> 0xc;
  auVar118._4_4_ = auVar285._4_4_ + 0x800 >> 0xc;
  auVar118._8_4_ = auVar285._8_4_ + 0x800 >> 0xc;
  auVar118._12_4_ = auVar285._12_4_ + 0x800 >> 0xc;
  auVar364 = packssdw(auVar324,auVar118);
  local_4b8 = auVar287._0_2_;
  uStack_4b6 = auVar287._2_2_;
  uStack_4b4 = auVar287._4_2_;
  uStack_4b2 = auVar287._6_2_;
  uStack_4b0 = auVar287._8_2_;
  uStack_4ae = auVar287._10_2_;
  uStack_4ac = auVar287._12_2_;
  uStack_4aa = auVar287._14_2_;
  auVar133._0_12_ = auVar228._0_12_;
  auVar133._12_2_ = auVar228._6_2_;
  auVar133._14_2_ = uStack_4b2;
  auVar75._12_4_ = auVar133._12_4_;
  auVar75._0_10_ = auVar228._0_10_;
  auVar75._10_2_ = uStack_4b4;
  auVar73._10_6_ = auVar75._10_6_;
  auVar73._0_8_ = auVar228._0_8_;
  auVar73._8_2_ = auVar228._4_2_;
  auVar72._8_8_ = auVar73._8_8_;
  auVar72._6_2_ = uStack_4b6;
  auVar72._4_2_ = auVar228._2_2_;
  auVar72._0_2_ = auVar228._0_2_;
  auVar72._2_2_ = local_4b8;
  auVar119._2_2_ = uStack_4b0;
  auVar119._0_2_ = auVar228._8_2_;
  auVar119._4_2_ = auVar228._10_2_;
  auVar119._6_2_ = uStack_4ae;
  auVar119._8_2_ = auVar228._12_2_;
  auVar119._10_2_ = uStack_4ac;
  auVar119._12_2_ = auVar228._14_2_;
  auVar119._14_2_ = uStack_4aa;
  auVar228 = pmaddwd(auVar72,auVar194);
  auVar132 = pmaddwd(auVar119,auVar194);
  auVar287 = pmaddwd(auVar72,auVar325);
  auVar285 = pmaddwd(auVar119,auVar325);
  auVar411._0_4_ = auVar287._0_4_ + 0x800 >> 0xc;
  auVar411._4_4_ = auVar287._4_4_ + 0x800 >> 0xc;
  auVar411._8_4_ = auVar287._8_4_ + 0x800 >> 0xc;
  auVar411._12_4_ = auVar287._12_4_ + 0x800 >> 0xc;
  auVar86._0_4_ = auVar285._0_4_ + 0x800 >> 0xc;
  auVar86._4_4_ = auVar285._4_4_ + 0x800 >> 0xc;
  auVar86._8_4_ = auVar285._8_4_ + 0x800 >> 0xc;
  auVar86._12_4_ = auVar285._12_4_ + 0x800 >> 0xc;
  auVar401 = packssdw(auVar411,auVar86);
  auVar134._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar134._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar134._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar134._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar120._0_4_ = auVar132._0_4_ + 0x800 >> 0xc;
  auVar120._4_4_ = auVar132._4_4_ + 0x800 >> 0xc;
  auVar120._8_4_ = auVar132._8_4_ + 0x800 >> 0xc;
  auVar120._12_4_ = auVar132._12_4_ + 0x800 >> 0xc;
  auVar228 = packssdw(auVar134,auVar120);
  local_758._0_2_ = auVar49._0_2_;
  local_758._2_2_ = auVar49._2_2_;
  local_758._4_2_ = auVar49._4_2_;
  local_758._6_2_ = auVar49._6_2_;
  uStack_750._0_2_ = auVar49._8_2_;
  uStack_750._2_2_ = auVar49._10_2_;
  uStack_750._4_2_ = auVar49._12_2_;
  uStack_750._6_2_ = auVar49._14_2_;
  auVar147._0_12_ = auVar260._0_12_;
  auVar147._12_2_ = auVar260._6_2_;
  auVar147._14_2_ = local_758._6_2_;
  auVar146._12_4_ = auVar147._12_4_;
  auVar146._0_10_ = auVar260._0_10_;
  auVar146._10_2_ = local_758._4_2_;
  auVar145._10_6_ = auVar146._10_6_;
  auVar145._0_8_ = auVar260._0_8_;
  auVar145._8_2_ = auVar260._4_2_;
  auVar144._8_8_ = auVar145._8_8_;
  auVar144._6_2_ = local_758._2_2_;
  auVar144._4_2_ = auVar260._2_2_;
  auVar144._0_2_ = auVar260._0_2_;
  auVar144._2_2_ = (undefined2)local_758;
  auVar234._2_2_ = (undefined2)uStack_750;
  auVar234._0_2_ = auVar260._8_2_;
  auVar234._4_2_ = auVar260._10_2_;
  auVar234._6_2_ = uStack_750._2_2_;
  auVar234._8_2_ = auVar260._12_2_;
  auVar234._10_2_ = uStack_750._4_2_;
  auVar234._12_2_ = auVar260._14_2_;
  auVar234._14_2_ = uStack_750._6_2_;
  auVar49 = pmaddwd(auVar144,auVar70);
  auVar285 = pmaddwd(auVar234,auVar70);
  auVar179._0_4_ = auVar49._0_4_ + 0x800 >> 0xc;
  auVar179._4_4_ = auVar49._4_4_ + 0x800 >> 0xc;
  auVar179._8_4_ = auVar49._8_4_ + 0x800 >> 0xc;
  auVar179._12_4_ = auVar49._12_4_ + 0x800 >> 0xc;
  auVar87._0_4_ = auVar285._0_4_ + 0x800 >> 0xc;
  auVar87._4_4_ = auVar285._4_4_ + 0x800 >> 0xc;
  auVar87._8_4_ = auVar285._8_4_ + 0x800 >> 0xc;
  auVar87._12_4_ = auVar285._12_4_ + 0x800 >> 0xc;
  auVar49 = packssdw(auVar179,auVar87);
  auVar285 = pmaddwd(auVar144,auVar325);
  auVar132 = pmaddwd(auVar234,auVar325);
  auVar148._0_4_ = auVar285._0_4_ + 0x800 >> 0xc;
  auVar148._4_4_ = auVar285._4_4_ + 0x800 >> 0xc;
  auVar148._8_4_ = auVar285._8_4_ + 0x800 >> 0xc;
  auVar148._12_4_ = auVar285._12_4_ + 0x800 >> 0xc;
  auVar235._0_4_ = auVar132._0_4_ + 0x800 >> 0xc;
  auVar235._4_4_ = auVar132._4_4_ + 0x800 >> 0xc;
  auVar235._8_4_ = auVar132._8_4_ + 0x800 >> 0xc;
  auVar235._12_4_ = auVar132._12_4_ + 0x800 >> 0xc;
  auVar7 = packssdw(auVar148,auVar235);
  local_768 = auVar187._0_2_;
  uStack_766 = auVar187._2_2_;
  uStack_764 = auVar187._4_2_;
  uStack_762 = auVar187._6_2_;
  uStack_760 = auVar187._8_2_;
  uStack_75e = auVar187._10_2_;
  uStack_75c = auVar187._12_2_;
  uStack_75a = auVar187._14_2_;
  auVar152._0_12_ = auVar183._0_12_;
  auVar152._12_2_ = auVar183._6_2_;
  auVar152._14_2_ = uStack_762;
  auVar151._12_4_ = auVar152._12_4_;
  auVar151._0_10_ = auVar183._0_10_;
  auVar151._10_2_ = uStack_764;
  auVar150._10_6_ = auVar151._10_6_;
  auVar150._0_8_ = auVar183._0_8_;
  auVar150._8_2_ = auVar183._4_2_;
  auVar149._8_8_ = auVar150._8_8_;
  auVar149._6_2_ = uStack_766;
  auVar149._4_2_ = auVar183._2_2_;
  auVar149._0_2_ = auVar183._0_2_;
  auVar149._2_2_ = local_768;
  auVar182._2_2_ = uStack_760;
  auVar182._0_2_ = auVar183._8_2_;
  auVar182._4_2_ = auVar183._10_2_;
  auVar182._6_2_ = uStack_75e;
  auVar182._8_2_ = auVar183._12_2_;
  auVar182._10_2_ = uStack_75c;
  auVar182._12_2_ = auVar183._14_2_;
  auVar182._14_2_ = uStack_75a;
  auVar285 = pmaddwd(auVar149,auVar70);
  auVar187 = pmaddwd(auVar182,auVar70);
  auVar236._0_4_ = auVar285._0_4_ + 0x800 >> 0xc;
  auVar236._4_4_ = auVar285._4_4_ + 0x800 >> 0xc;
  auVar236._8_4_ = auVar285._8_4_ + 0x800 >> 0xc;
  auVar236._12_4_ = auVar285._12_4_ + 0x800 >> 0xc;
  auVar88._0_4_ = auVar187._0_4_ + 0x800 >> 0xc;
  auVar88._4_4_ = auVar187._4_4_ + 0x800 >> 0xc;
  auVar88._8_4_ = auVar187._8_4_ + 0x800 >> 0xc;
  auVar88._12_4_ = auVar187._12_4_ + 0x800 >> 0xc;
  auVar73 = packssdw(auVar236,auVar88);
  auVar285 = pmaddwd(auVar149,auVar325);
  auVar187 = pmaddwd(auVar182,auVar325);
  auVar153._0_4_ = auVar285._0_4_ + 0x800 >> 0xc;
  auVar153._4_4_ = auVar285._4_4_ + 0x800 >> 0xc;
  auVar153._8_4_ = auVar285._8_4_ + 0x800 >> 0xc;
  auVar153._12_4_ = auVar285._12_4_ + 0x800 >> 0xc;
  auVar183._0_4_ = auVar187._0_4_ + 0x800 >> 0xc;
  auVar183._4_4_ = auVar187._4_4_ + 0x800 >> 0xc;
  auVar183._8_4_ = auVar187._8_4_ + 0x800 >> 0xc;
  auVar183._12_4_ = auVar187._12_4_ + 0x800 >> 0xc;
  auVar71 = packssdw(auVar153,auVar183);
  local_7a8 = auVar400._0_2_;
  uStack_7a6 = auVar400._2_2_;
  uStack_7a4 = auVar400._4_2_;
  uStack_7a2 = auVar400._6_2_;
  uStack_7a0 = auVar400._8_2_;
  uStack_79e = auVar400._10_2_;
  uStack_79c = auVar400._12_2_;
  uStack_79a = auVar400._14_2_;
  auVar429._0_12_ = auVar255._0_12_;
  auVar429._12_2_ = auVar255._6_2_;
  auVar429._14_2_ = uStack_7a2;
  auVar428._12_4_ = auVar429._12_4_;
  auVar428._0_10_ = auVar255._0_10_;
  auVar428._10_2_ = uStack_7a4;
  auVar427._10_6_ = auVar428._10_6_;
  auVar427._0_8_ = auVar255._0_8_;
  auVar427._8_2_ = auVar255._4_2_;
  auVar426._8_8_ = auVar427._8_8_;
  auVar426._6_2_ = uStack_7a6;
  auVar426._4_2_ = auVar255._2_2_;
  auVar426._0_2_ = auVar255._0_2_;
  auVar426._2_2_ = local_7a8;
  auVar184._2_2_ = uStack_7a0;
  auVar184._0_2_ = auVar255._8_2_;
  auVar184._4_2_ = auVar255._10_2_;
  auVar184._6_2_ = uStack_79e;
  auVar184._8_2_ = auVar255._12_2_;
  auVar184._10_2_ = uStack_79c;
  auVar184._12_2_ = auVar255._14_2_;
  auVar184._14_2_ = uStack_79a;
  auVar285 = pmaddwd(auVar426,auVar70);
  auVar187 = pmaddwd(auVar184,auVar70);
  auVar389._0_4_ = auVar285._0_4_ + 0x800 >> 0xc;
  auVar389._4_4_ = auVar285._4_4_ + 0x800 >> 0xc;
  auVar389._8_4_ = auVar285._8_4_ + 0x800 >> 0xc;
  auVar389._12_4_ = auVar285._12_4_ + 0x800 >> 0xc;
  auVar89._0_4_ = auVar187._0_4_ + 0x800 >> 0xc;
  auVar89._4_4_ = auVar187._4_4_ + 0x800 >> 0xc;
  auVar89._8_4_ = auVar187._8_4_ + 0x800 >> 0xc;
  auVar89._12_4_ = auVar187._12_4_ + 0x800 >> 0xc;
  auVar376 = packssdw(auVar389,auVar89);
  auVar285 = pmaddwd(auVar426,auVar325);
  auVar187 = pmaddwd(auVar184,auVar325);
  auVar430._0_4_ = auVar285._0_4_ + 0x800 >> 0xc;
  auVar430._4_4_ = auVar285._4_4_ + 0x800 >> 0xc;
  auVar430._8_4_ = auVar285._8_4_ + 0x800 >> 0xc;
  auVar430._12_4_ = auVar285._12_4_ + 0x800 >> 0xc;
  auVar185._0_4_ = auVar187._0_4_ + 0x800 >> 0xc;
  auVar185._4_4_ = auVar187._4_4_ + 0x800 >> 0xc;
  auVar185._8_4_ = auVar187._8_4_ + 0x800 >> 0xc;
  auVar185._12_4_ = auVar187._12_4_ + 0x800 >> 0xc;
  auVar431 = packssdw(auVar430,auVar185);
  local_788 = auVar407._0_2_;
  uStack_786 = auVar407._2_2_;
  uStack_784 = auVar407._4_2_;
  uStack_782 = auVar407._6_2_;
  uStack_780 = auVar407._8_2_;
  uStack_77e = auVar407._10_2_;
  uStack_77c = auVar407._12_2_;
  uStack_77a = auVar407._14_2_;
  auVar157._0_12_ = auVar284._0_12_;
  auVar157._12_2_ = auVar284._6_2_;
  auVar157._14_2_ = uStack_782;
  auVar156._12_4_ = auVar157._12_4_;
  auVar156._0_10_ = auVar284._0_10_;
  auVar156._10_2_ = uStack_784;
  auVar155._10_6_ = auVar156._10_6_;
  auVar155._0_8_ = auVar284._0_8_;
  auVar155._8_2_ = auVar284._4_2_;
  auVar154._8_8_ = auVar155._8_8_;
  auVar154._6_2_ = uStack_786;
  auVar154._4_2_ = auVar284._2_2_;
  auVar154._0_2_ = auVar284._0_2_;
  auVar154._2_2_ = local_788;
  auVar237._2_2_ = uStack_780;
  auVar237._0_2_ = auVar284._8_2_;
  auVar237._4_2_ = auVar284._10_2_;
  auVar237._6_2_ = uStack_77e;
  auVar237._8_2_ = auVar284._12_2_;
  auVar237._10_2_ = uStack_77c;
  auVar237._12_2_ = auVar284._14_2_;
  auVar237._14_2_ = uStack_77a;
  auVar255 = pmaddwd(auVar154,auVar70);
  auVar187 = pmaddwd(auVar70,auVar237);
  auVar285 = pmaddwd(auVar154,auVar325);
  auVar132 = pmaddwd(auVar237,auVar325);
  auVar359._0_4_ = auVar255._0_4_ + 0x800 >> 0xc;
  auVar359._4_4_ = auVar255._4_4_ + 0x800 >> 0xc;
  auVar359._8_4_ = auVar255._8_4_ + 0x800 >> 0xc;
  auVar359._12_4_ = auVar255._12_4_ + 0x800 >> 0xc;
  auVar121._0_4_ = auVar187._0_4_ + 0x800 >> 0xc;
  auVar121._4_4_ = auVar187._4_4_ + 0x800 >> 0xc;
  auVar121._8_4_ = auVar187._8_4_ + 0x800 >> 0xc;
  auVar121._12_4_ = auVar187._12_4_ + 0x800 >> 0xc;
  auVar183 = packssdw(auVar359,auVar121);
  auVar158._0_4_ = auVar285._0_4_ + 0x800 >> 0xc;
  auVar158._4_4_ = auVar285._4_4_ + 0x800 >> 0xc;
  auVar158._8_4_ = auVar285._8_4_ + 0x800 >> 0xc;
  auVar158._12_4_ = auVar285._12_4_ + 0x800 >> 0xc;
  auVar238._0_4_ = auVar132._0_4_ + 0x800 >> 0xc;
  auVar238._4_4_ = auVar132._4_4_ + 0x800 >> 0xc;
  auVar238._8_4_ = auVar132._8_4_ + 0x800 >> 0xc;
  auVar238._12_4_ = auVar132._12_4_ + 0x800 >> 0xc;
  auVar255 = packssdw(auVar158,auVar238);
  auVar284 = paddsw(auVar35,auVar55);
  auVar55 = psubsw(auVar35,auVar55);
  auVar400 = paddsw(auVar192,auVar177);
  auVar177 = psubsw(auVar192,auVar177);
  auVar407 = paddsw(auVar291,auVar190);
  auVar187 = psubsw(auVar291,auVar190);
  auVar35 = paddsw(auVar141,auVar213);
  auVar192 = psubsw(auVar141,auVar213);
  auVar285 = paddsw(auVar370,auVar189);
  auVar291 = psubsw(auVar370,auVar189);
  auVar141 = paddsw(auVar13,auVar116);
  auVar13 = psubsw(auVar13,auVar116);
  auVar213 = paddsw(auVar82,auVar51);
  auVar82 = psubsw(auVar82,auVar51);
  auVar287 = paddsw(auVar36,auVar69);
  auVar132 = psubsw(auVar36,auVar69);
  auVar303._0_12_ = auVar135._0_12_;
  auVar303._12_2_ = auVar135._6_2_;
  auVar303._14_2_ = auVar186._6_2_;
  auVar302._12_4_ = auVar303._12_4_;
  auVar302._0_10_ = auVar135._0_10_;
  auVar302._10_2_ = auVar186._4_2_;
  auVar301._10_6_ = auVar302._10_6_;
  auVar301._0_8_ = auVar135._0_8_;
  auVar301._8_2_ = auVar135._4_2_;
  auVar300._8_8_ = auVar301._8_8_;
  auVar300._6_2_ = auVar186._2_2_;
  auVar300._4_2_ = auVar135._2_2_;
  auVar300._0_2_ = auVar135._0_2_;
  auVar300._2_2_ = auVar186._0_2_;
  auVar90._2_2_ = auVar186._8_2_;
  auVar90._0_2_ = auVar135._8_2_;
  auVar90._4_2_ = auVar135._10_2_;
  auVar90._6_2_ = auVar186._10_2_;
  auVar90._8_2_ = auVar135._12_2_;
  auVar90._10_2_ = auVar186._12_2_;
  auVar90._12_2_ = auVar135._14_2_;
  auVar90._14_2_ = auVar186._14_2_;
  auVar135 = pmaddwd(auVar300,auVar20);
  auVar51 = pmaddwd(auVar90,auVar20);
  auVar159._0_4_ = auVar135._0_4_ + 0x800 >> 0xc;
  auVar159._4_4_ = auVar135._4_4_ + 0x800 >> 0xc;
  auVar159._8_4_ = auVar135._8_4_ + 0x800 >> 0xc;
  auVar159._12_4_ = auVar135._12_4_ + 0x800 >> 0xc;
  auVar69._0_4_ = auVar51._0_4_ + 0x800 >> 0xc;
  auVar69._4_4_ = auVar51._4_4_ + 0x800 >> 0xc;
  auVar69._8_4_ = auVar51._8_4_ + 0x800 >> 0xc;
  auVar69._12_4_ = auVar51._12_4_ + 0x800 >> 0xc;
  auVar116 = packssdw(auVar159,auVar69);
  auVar135 = pmaddwd(auVar300,auVar21);
  auVar51 = pmaddwd(auVar90,auVar21);
  auVar304._0_4_ = auVar135._0_4_ + 0x800 >> 0xc;
  auVar304._4_4_ = auVar135._4_4_ + 0x800 >> 0xc;
  auVar304._8_4_ = auVar135._8_4_ + 0x800 >> 0xc;
  auVar304._12_4_ = auVar135._12_4_ + 0x800 >> 0xc;
  auVar91._0_4_ = auVar51._0_4_ + 0x800 >> 0xc;
  auVar91._4_4_ = auVar51._4_4_ + 0x800 >> 0xc;
  auVar91._8_4_ = auVar51._8_4_ + 0x800 >> 0xc;
  auVar91._12_4_ = auVar51._12_4_ + 0x800 >> 0xc;
  auVar260 = packssdw(auVar304,auVar91);
  local_5a8 = auVar66._0_2_;
  uStack_5a6 = auVar66._2_2_;
  uStack_5a4 = auVar66._4_2_;
  uStack_5a2 = auVar66._6_2_;
  uStack_5a0 = auVar66._8_2_;
  uStack_59e = auVar66._10_2_;
  uStack_59c = auVar66._12_2_;
  uStack_59a = auVar66._14_2_;
  auVar221._0_12_ = auVar103._0_12_;
  auVar221._12_2_ = auVar103._6_2_;
  auVar221._14_2_ = uStack_5a2;
  auVar220._12_4_ = auVar221._12_4_;
  auVar220._0_10_ = auVar103._0_10_;
  auVar220._10_2_ = uStack_5a4;
  auVar219._10_6_ = auVar220._10_6_;
  auVar219._0_8_ = auVar103._0_8_;
  auVar219._8_2_ = auVar103._4_2_;
  auVar218._8_8_ = auVar219._8_8_;
  auVar218._6_2_ = uStack_5a6;
  auVar218._4_2_ = auVar103._2_2_;
  auVar218._0_2_ = auVar103._0_2_;
  auVar218._2_2_ = local_5a8;
  auVar43._2_2_ = uStack_5a0;
  auVar43._0_2_ = auVar103._8_2_;
  auVar43._4_2_ = auVar103._10_2_;
  auVar43._6_2_ = uStack_59e;
  auVar43._8_2_ = auVar103._12_2_;
  auVar43._10_2_ = uStack_59c;
  auVar43._12_2_ = auVar103._14_2_;
  auVar43._14_2_ = uStack_59a;
  auVar103 = pmaddwd(auVar218,auVar20);
  auVar51 = pmaddwd(auVar43,auVar20);
  auVar335._0_4_ = auVar103._0_4_ + 0x800 >> 0xc;
  auVar335._4_4_ = auVar103._4_4_ + 0x800 >> 0xc;
  auVar335._8_4_ = auVar103._8_4_ + 0x800 >> 0xc;
  auVar335._12_4_ = auVar103._12_4_ + 0x800 >> 0xc;
  auVar186._0_4_ = auVar51._0_4_ + 0x800 >> 0xc;
  auVar186._4_4_ = auVar51._4_4_ + 0x800 >> 0xc;
  auVar186._8_4_ = auVar51._8_4_ + 0x800 >> 0xc;
  auVar186._12_4_ = auVar51._12_4_ + 0x800 >> 0xc;
  auVar370 = packssdw(auVar335,auVar186);
  auVar103 = pmaddwd(auVar218,auVar21);
  auVar51 = pmaddwd(auVar43,auVar21);
  auVar222._0_4_ = auVar103._0_4_ + 0x800 >> 0xc;
  auVar222._4_4_ = auVar103._4_4_ + 0x800 >> 0xc;
  auVar222._8_4_ = auVar103._8_4_ + 0x800 >> 0xc;
  auVar222._12_4_ = auVar103._12_4_ + 0x800 >> 0xc;
  auVar44._0_4_ = auVar51._0_4_ + 0x800 >> 0xc;
  auVar44._4_4_ = auVar51._4_4_ + 0x800 >> 0xc;
  auVar44._8_4_ = auVar51._8_4_ + 0x800 >> 0xc;
  auVar44._12_4_ = auVar51._12_4_ + 0x800 >> 0xc;
  auVar72 = packssdw(auVar222,auVar44);
  local_598 = auVar181._0_2_;
  uStack_596 = auVar181._2_2_;
  uStack_594 = auVar181._4_2_;
  uStack_592 = auVar181._6_2_;
  uStack_590 = auVar181._8_2_;
  uStack_58e = auVar181._10_2_;
  uStack_58c = auVar181._12_2_;
  uStack_58a = auVar181._14_2_;
  auVar163._0_12_ = auVar245._0_12_;
  auVar163._12_2_ = auVar245._6_2_;
  auVar163._14_2_ = uStack_592;
  auVar162._12_4_ = auVar163._12_4_;
  auVar162._0_10_ = auVar245._0_10_;
  auVar162._10_2_ = uStack_594;
  auVar161._10_6_ = auVar162._10_6_;
  auVar161._0_8_ = auVar245._0_8_;
  auVar161._8_2_ = auVar245._4_2_;
  auVar160._8_8_ = auVar161._8_8_;
  auVar160._6_2_ = uStack_596;
  auVar160._4_2_ = auVar245._2_2_;
  auVar160._0_2_ = auVar245._0_2_;
  auVar160._2_2_ = local_598;
  auVar92._2_2_ = uStack_590;
  auVar92._0_2_ = auVar245._8_2_;
  auVar92._4_2_ = auVar245._10_2_;
  auVar92._6_2_ = uStack_58e;
  auVar92._8_2_ = auVar245._12_2_;
  auVar92._10_2_ = uStack_58c;
  auVar92._12_2_ = auVar245._14_2_;
  auVar92._14_2_ = uStack_58a;
  auVar51 = pmaddwd(auVar160,auVar20);
  auVar245 = pmaddwd(auVar92,auVar20);
  auVar239._0_4_ = auVar51._0_4_ + 0x800 >> 0xc;
  auVar239._4_4_ = auVar51._4_4_ + 0x800 >> 0xc;
  auVar239._8_4_ = auVar51._8_4_ + 0x800 >> 0xc;
  auVar239._12_4_ = auVar51._12_4_ + 0x800 >> 0xc;
  auVar189._0_4_ = auVar245._0_4_ + 0x800 >> 0xc;
  auVar189._4_4_ = auVar245._4_4_ + 0x800 >> 0xc;
  auVar189._8_4_ = auVar245._8_4_ + 0x800 >> 0xc;
  auVar189._12_4_ = auVar245._12_4_ + 0x800 >> 0xc;
  auVar75 = packssdw(auVar239,auVar189);
  auVar51 = pmaddwd(auVar160,auVar21);
  auVar245 = pmaddwd(auVar92,auVar21);
  auVar164._0_4_ = auVar51._0_4_ + 0x800 >> 0xc;
  auVar164._4_4_ = auVar51._4_4_ + 0x800 >> 0xc;
  auVar164._8_4_ = auVar51._8_4_ + 0x800 >> 0xc;
  auVar164._12_4_ = auVar51._12_4_ + 0x800 >> 0xc;
  auVar93._0_4_ = auVar245._0_4_ + 0x800 >> 0xc;
  auVar93._4_4_ = auVar245._4_4_ + 0x800 >> 0xc;
  auVar93._8_4_ = auVar245._8_4_ + 0x800 >> 0xc;
  auVar93._12_4_ = auVar245._12_4_ + 0x800 >> 0xc;
  auVar36 = packssdw(auVar164,auVar93);
  local_6e8 = auVar358._0_2_;
  uStack_6e6 = auVar358._2_2_;
  uStack_6e4 = auVar358._4_2_;
  uStack_6e2 = auVar358._6_2_;
  uStack_6e0 = auVar358._8_2_;
  uStack_6de = auVar358._10_2_;
  uStack_6dc = auVar358._12_2_;
  uStack_6da = auVar358._14_2_;
  auVar97._0_12_ = auVar410._0_12_;
  auVar97._12_2_ = auVar410._6_2_;
  auVar97._14_2_ = uStack_6e2;
  auVar96._12_4_ = auVar97._12_4_;
  auVar96._0_10_ = auVar410._0_10_;
  auVar96._10_2_ = uStack_6e4;
  auVar95._10_6_ = auVar96._10_6_;
  auVar95._0_8_ = auVar410._0_8_;
  auVar95._8_2_ = auVar410._4_2_;
  auVar94._8_8_ = auVar95._8_8_;
  auVar94._6_2_ = uStack_6e6;
  auVar94._4_2_ = auVar410._2_2_;
  auVar94._0_2_ = auVar410._0_2_;
  auVar94._2_2_ = local_6e8;
  auVar190._2_2_ = uStack_6e0;
  auVar190._0_2_ = auVar410._8_2_;
  auVar190._4_2_ = auVar410._10_2_;
  auVar190._6_2_ = uStack_6de;
  auVar190._8_2_ = auVar410._12_2_;
  auVar190._10_2_ = uStack_6dc;
  auVar190._12_2_ = auVar410._14_2_;
  auVar190._14_2_ = uStack_6da;
  auVar245 = pmaddwd(auVar94,auVar20);
  auVar51 = pmaddwd(auVar190,auVar20);
  auVar122._0_4_ = auVar245._0_4_ + 0x800 >> 0xc;
  auVar122._4_4_ = auVar245._4_4_ + 0x800 >> 0xc;
  auVar122._8_4_ = auVar245._8_4_ + 0x800 >> 0xc;
  auVar122._12_4_ = auVar245._12_4_ + 0x800 >> 0xc;
  auVar278._0_4_ = auVar51._0_4_ + 0x800 >> 0xc;
  auVar278._4_4_ = auVar51._4_4_ + 0x800 >> 0xc;
  auVar278._8_4_ = auVar51._8_4_ + 0x800 >> 0xc;
  auVar278._12_4_ = auVar51._12_4_ + 0x800 >> 0xc;
  auVar113 = packssdw(auVar122,auVar278);
  auVar51 = pmaddwd(auVar94,auVar21);
  auVar245 = pmaddwd(auVar190,auVar21);
  auVar98._0_4_ = auVar51._0_4_ + 0x800 >> 0xc;
  auVar98._4_4_ = auVar51._4_4_ + 0x800 >> 0xc;
  auVar98._8_4_ = auVar51._8_4_ + 0x800 >> 0xc;
  auVar98._12_4_ = auVar51._12_4_ + 0x800 >> 0xc;
  auVar197._0_4_ = auVar245._0_4_ + 0x800 >> 0xc;
  auVar197._4_4_ = auVar245._4_4_ + 0x800 >> 0xc;
  auVar197._8_4_ = auVar245._8_4_ + 0x800 >> 0xc;
  auVar197._12_4_ = auVar245._12_4_ + 0x800 >> 0xc;
  auVar286 = packssdw(auVar98,auVar197);
  auVar245 = paddsw(auVar347,auVar231);
  auVar358 = psubsw(auVar347,auVar231);
  auVar133 = paddsw(auVar353,auVar258);
  auVar51 = psubsw(auVar353,auVar258);
  auVar134 = paddsw(auVar74,auVar4);
  auVar4 = psubsw(auVar74,auVar4);
  auVar179 = paddsw(auVar288,auVar47);
  auVar47 = psubsw(auVar288,auVar47);
  auVar182 = paddsw(auVar114,auVar183);
  auVar74 = psubsw(auVar114,auVar183);
  auVar183 = paddsw(auVar422,auVar376);
  auVar288 = psubsw(auVar422,auVar376);
  auVar184 = paddsw(auVar247,auVar73);
  auVar103 = psubsw(auVar247,auVar73);
  auVar73 = paddsw(auVar401,auVar49);
  auVar197 = psubsw(auVar401,auVar49);
  auVar185 = psubsw(auVar290,auVar354);
  auVar135 = paddsw(auVar290,auVar354);
  auVar69 = psubsw(auVar191,auVar296);
  auVar181 = paddsw(auVar191,auVar296);
  auVar66 = psubsw(auVar3,auVar188);
  auVar3 = paddsw(auVar3,auVar188);
  auVar422 = psubsw(auVar2,auVar289);
  auVar2 = paddsw(auVar2,auVar289);
  auVar190 = psubsw(auVar198,auVar255);
  auVar49 = paddsw(auVar255,auVar198);
  auVar189 = psubsw(auVar257,auVar431);
  auVar376 = paddsw(auVar431,auVar257);
  auVar186 = psubsw(auVar364,auVar71);
  auVar247 = paddsw(auVar71,auVar364);
  auVar114 = psubsw(auVar228,auVar7);
  auVar228 = paddsw(auVar7,auVar228);
  auVar255 = paddsw(auVar284,auVar215);
  auVar7 = psubsw(auVar284,auVar215);
  auVar284 = paddsw(auVar400,auVar217);
  auVar71 = psubsw(auVar400,auVar217);
  auVar400 = paddsw(auVar407,auVar270);
  auVar401 = psubsw(auVar407,auVar270);
  auVar410 = paddsw(auVar35,auVar385);
  auVar231 = psubsw(auVar35,auVar385);
  auVar407 = paddsw(auVar285,auVar260);
  auVar258 = psubsw(auVar285,auVar260);
  auVar285 = paddsw(auVar141,auVar72);
  auVar188 = psubsw(auVar141,auVar72);
  auVar35 = paddsw(auVar213,auVar36);
  auVar289 = psubsw(auVar213,auVar36);
  auVar36 = paddsw(auVar287,auVar286);
  auVar290 = psubsw(auVar287,auVar286);
  auVar141 = paddsw(auVar132,auVar113);
  auVar191 = psubsw(auVar132,auVar113);
  auVar132 = paddsw(auVar82,auVar75);
  auVar82 = psubsw(auVar82,auVar75);
  auVar213 = paddsw(auVar13,auVar370);
  auVar13 = psubsw(auVar13,auVar370);
  auVar215 = paddsw(auVar291,auVar116);
  auVar291 = psubsw(auVar291,auVar116);
  auVar385 = paddsw(auVar192,auVar327);
  auVar192 = psubsw(auVar192,auVar327);
  auVar287 = paddsw(auVar187,auVar326);
  auVar187 = psubsw(auVar187,auVar326);
  auVar286 = paddsw(auVar177,auVar295);
  auVar217 = psubsw(auVar177,auVar295);
  auVar270 = paddsw(auVar55,auVar293);
  auVar55 = psubsw(auVar55,auVar293);
  auVar126._0_12_ = auVar197._0_12_;
  auVar126._12_2_ = auVar197._6_2_;
  auVar126._14_2_ = auVar114._6_2_;
  auVar125._12_4_ = auVar126._12_4_;
  auVar125._0_10_ = auVar197._0_10_;
  auVar125._10_2_ = auVar114._4_2_;
  auVar124._10_6_ = auVar125._10_6_;
  auVar124._0_8_ = auVar197._0_8_;
  auVar124._8_2_ = auVar197._4_2_;
  auVar123._8_8_ = auVar124._8_8_;
  auVar123._6_2_ = auVar114._2_2_;
  auVar123._4_2_ = auVar197._2_2_;
  auVar123._0_2_ = auVar197._0_2_;
  auVar123._2_2_ = auVar114._0_2_;
  auVar412._2_2_ = auVar114._8_2_;
  auVar412._0_2_ = auVar197._8_2_;
  auVar412._4_2_ = auVar197._10_2_;
  auVar412._6_2_ = auVar114._10_2_;
  auVar412._8_2_ = auVar197._12_2_;
  auVar412._10_2_ = auVar114._12_2_;
  auVar412._12_2_ = auVar197._14_2_;
  auVar412._14_2_ = auVar114._14_2_;
  auVar113 = pmaddwd(auVar123,auVar20);
  auVar177 = pmaddwd(auVar412,auVar20);
  auVar99._0_4_ = auVar113._0_4_ + 0x800 >> 0xc;
  auVar99._4_4_ = auVar113._4_4_ + 0x800 >> 0xc;
  auVar99._8_4_ = auVar113._8_4_ + 0x800 >> 0xc;
  auVar99._12_4_ = auVar113._12_4_ + 0x800 >> 0xc;
  auVar198._0_4_ = auVar177._0_4_ + 0x800 >> 0xc;
  auVar198._4_4_ = auVar177._4_4_ + 0x800 >> 0xc;
  auVar198._8_4_ = auVar177._8_4_ + 0x800 >> 0xc;
  auVar198._12_4_ = auVar177._12_4_ + 0x800 >> 0xc;
  auVar113 = packssdw(auVar99,auVar198);
  auVar177 = pmaddwd(auVar123,auVar21);
  auVar114 = pmaddwd(auVar412,auVar21);
  auVar127._0_4_ = auVar177._0_4_ + 0x800 >> 0xc;
  auVar127._4_4_ = auVar177._4_4_ + 0x800 >> 0xc;
  auVar127._8_4_ = auVar177._8_4_ + 0x800 >> 0xc;
  auVar127._12_4_ = auVar177._12_4_ + 0x800 >> 0xc;
  auVar413._0_4_ = auVar114._0_4_ + 0x800 >> 0xc;
  auVar413._4_4_ = auVar114._4_4_ + 0x800 >> 0xc;
  auVar413._8_4_ = auVar114._8_4_ + 0x800 >> 0xc;
  auVar413._12_4_ = auVar114._12_4_ + 0x800 >> 0xc;
  auVar114 = packssdw(auVar127,auVar413);
  auVar393._0_12_ = auVar103._0_12_;
  auVar393._12_2_ = auVar103._6_2_;
  auVar393._14_2_ = auVar186._6_2_;
  auVar392._12_4_ = auVar393._12_4_;
  auVar392._0_10_ = auVar103._0_10_;
  auVar392._10_2_ = auVar186._4_2_;
  auVar391._10_6_ = auVar392._10_6_;
  auVar391._0_8_ = auVar103._0_8_;
  auVar391._8_2_ = auVar103._4_2_;
  auVar390._8_8_ = auVar391._8_8_;
  auVar390._6_2_ = auVar186._2_2_;
  auVar390._4_2_ = auVar103._2_2_;
  auVar390._0_2_ = auVar103._0_2_;
  auVar390._2_2_ = auVar186._0_2_;
  auVar165._2_2_ = auVar186._8_2_;
  auVar165._0_2_ = auVar103._8_2_;
  auVar165._4_2_ = auVar103._10_2_;
  auVar165._6_2_ = auVar186._10_2_;
  auVar165._8_2_ = auVar103._12_2_;
  auVar165._10_2_ = auVar186._12_2_;
  auVar165._12_2_ = auVar103._14_2_;
  auVar165._14_2_ = auVar186._14_2_;
  auVar103 = pmaddwd(auVar390,auVar20);
  auVar177 = pmaddwd(auVar165,auVar20);
  auVar223._0_4_ = auVar103._0_4_ + 0x800 >> 0xc;
  auVar223._4_4_ = auVar103._4_4_ + 0x800 >> 0xc;
  auVar223._8_4_ = auVar103._8_4_ + 0x800 >> 0xc;
  auVar223._12_4_ = auVar103._12_4_ + 0x800 >> 0xc;
  auVar347._0_4_ = auVar177._0_4_ + 0x800 >> 0xc;
  auVar347._4_4_ = auVar177._4_4_ + 0x800 >> 0xc;
  auVar347._8_4_ = auVar177._8_4_ + 0x800 >> 0xc;
  auVar347._12_4_ = auVar177._12_4_ + 0x800 >> 0xc;
  auVar103 = packssdw(auVar223,auVar347);
  auVar116 = pmaddwd(auVar390,auVar21);
  auVar177 = pmaddwd(auVar165,auVar21);
  auVar394._0_4_ = auVar116._0_4_ + 0x800 >> 0xc;
  auVar394._4_4_ = auVar116._4_4_ + 0x800 >> 0xc;
  auVar394._8_4_ = auVar116._8_4_ + 0x800 >> 0xc;
  auVar394._12_4_ = auVar116._12_4_ + 0x800 >> 0xc;
  auVar166._0_4_ = auVar177._0_4_ + 0x800 >> 0xc;
  auVar166._4_4_ = auVar177._4_4_ + 0x800 >> 0xc;
  auVar166._8_4_ = auVar177._8_4_ + 0x800 >> 0xc;
  auVar166._12_4_ = auVar177._12_4_ + 0x800 >> 0xc;
  auVar326 = packssdw(auVar394,auVar166);
  auVar243._0_12_ = auVar288._0_12_;
  auVar243._12_2_ = auVar288._6_2_;
  auVar243._14_2_ = auVar189._6_2_;
  auVar242._12_4_ = auVar243._12_4_;
  auVar242._0_10_ = auVar288._0_10_;
  auVar242._10_2_ = auVar189._4_2_;
  auVar241._10_6_ = auVar242._10_6_;
  auVar241._0_8_ = auVar288._0_8_;
  auVar241._8_2_ = auVar288._4_2_;
  auVar240._8_8_ = auVar241._8_8_;
  auVar240._6_2_ = auVar189._2_2_;
  auVar240._4_2_ = auVar288._2_2_;
  auVar240._0_2_ = auVar288._0_2_;
  auVar240._2_2_ = auVar189._0_2_;
  auVar167._2_2_ = auVar189._8_2_;
  auVar167._0_2_ = auVar288._8_2_;
  auVar167._4_2_ = auVar288._10_2_;
  auVar167._6_2_ = auVar189._10_2_;
  auVar167._8_2_ = auVar288._12_2_;
  auVar167._10_2_ = auVar189._12_2_;
  auVar167._12_2_ = auVar288._14_2_;
  auVar167._14_2_ = auVar189._14_2_;
  auVar288 = pmaddwd(auVar240,auVar20);
  auVar177 = pmaddwd(auVar167,auVar20);
  auVar224._0_4_ = auVar288._0_4_ + 0x800 >> 0xc;
  auVar224._4_4_ = auVar288._4_4_ + 0x800 >> 0xc;
  auVar224._8_4_ = auVar288._8_4_ + 0x800 >> 0xc;
  auVar224._12_4_ = auVar288._12_4_ + 0x800 >> 0xc;
  auVar353._0_4_ = auVar177._0_4_ + 0x800 >> 0xc;
  auVar353._4_4_ = auVar177._4_4_ + 0x800 >> 0xc;
  auVar353._8_4_ = auVar177._8_4_ + 0x800 >> 0xc;
  auVar353._12_4_ = auVar177._12_4_ + 0x800 >> 0xc;
  auVar288 = packssdw(auVar224,auVar353);
  auVar116 = pmaddwd(auVar240,auVar21);
  auVar177 = pmaddwd(auVar167,auVar21);
  auVar244._0_4_ = auVar116._0_4_ + 0x800 >> 0xc;
  auVar244._4_4_ = auVar116._4_4_ + 0x800 >> 0xc;
  auVar244._8_4_ = auVar116._8_4_ + 0x800 >> 0xc;
  auVar244._12_4_ = auVar116._12_4_ + 0x800 >> 0xc;
  auVar168._0_4_ = auVar177._0_4_ + 0x800 >> 0xc;
  auVar168._4_4_ = auVar177._4_4_ + 0x800 >> 0xc;
  auVar168._8_4_ = auVar177._8_4_ + 0x800 >> 0xc;
  auVar168._12_4_ = auVar177._12_4_ + 0x800 >> 0xc;
  auVar116 = packssdw(auVar244,auVar168);
  auVar308._0_12_ = auVar74._0_12_;
  auVar308._12_2_ = auVar74._6_2_;
  auVar308._14_2_ = auVar190._6_2_;
  auVar307._12_4_ = auVar308._12_4_;
  auVar307._0_10_ = auVar74._0_10_;
  auVar307._10_2_ = auVar190._4_2_;
  auVar306._10_6_ = auVar307._10_6_;
  auVar306._0_8_ = auVar74._0_8_;
  auVar306._8_2_ = auVar74._4_2_;
  auVar305._8_8_ = auVar306._8_8_;
  auVar305._6_2_ = auVar190._2_2_;
  auVar305._4_2_ = auVar74._2_2_;
  auVar305._0_2_ = auVar74._0_2_;
  auVar305._2_2_ = auVar190._0_2_;
  auVar169._2_2_ = auVar190._8_2_;
  auVar169._0_2_ = auVar74._8_2_;
  auVar169._4_2_ = auVar74._10_2_;
  auVar169._6_2_ = auVar190._10_2_;
  auVar169._8_2_ = auVar74._12_2_;
  auVar169._10_2_ = auVar190._12_2_;
  auVar169._12_2_ = auVar74._14_2_;
  auVar169._14_2_ = auVar190._14_2_;
  auVar74 = pmaddwd(auVar305,auVar20);
  auVar177 = pmaddwd(auVar169,auVar20);
  auVar225._0_4_ = auVar74._0_4_ + 0x800 >> 0xc;
  auVar225._4_4_ = auVar74._4_4_ + 0x800 >> 0xc;
  auVar225._8_4_ = auVar74._8_4_ + 0x800 >> 0xc;
  auVar225._12_4_ = auVar74._12_4_ + 0x800 >> 0xc;
  auVar260._0_4_ = auVar177._0_4_ + 0x800 >> 0xc;
  auVar260._4_4_ = auVar177._4_4_ + 0x800 >> 0xc;
  auVar260._8_4_ = auVar177._8_4_ + 0x800 >> 0xc;
  auVar260._12_4_ = auVar177._12_4_ + 0x800 >> 0xc;
  auVar74 = packssdw(auVar225,auVar260);
  auVar293 = pmaddwd(auVar305,auVar21);
  auVar177 = pmaddwd(auVar169,auVar21);
  auVar309._0_4_ = auVar293._0_4_ + 0x800 >> 0xc;
  auVar309._4_4_ = auVar293._4_4_ + 0x800 >> 0xc;
  auVar309._8_4_ = auVar293._8_4_ + 0x800 >> 0xc;
  auVar309._12_4_ = auVar293._12_4_ + 0x800 >> 0xc;
  auVar170._0_4_ = auVar177._0_4_ + 0x800 >> 0xc;
  auVar170._4_4_ = auVar177._4_4_ + 0x800 >> 0xc;
  auVar170._8_4_ = auVar177._8_4_ + 0x800 >> 0xc;
  auVar170._12_4_ = auVar177._12_4_ + 0x800 >> 0xc;
  auVar293 = packssdw(auVar309,auVar170);
  local_5a8 = auVar422._0_2_;
  uStack_5a6 = auVar422._2_2_;
  uStack_5a4 = auVar422._4_2_;
  uStack_5a2 = auVar422._6_2_;
  uStack_5a0 = auVar422._8_2_;
  uStack_59e = auVar422._10_2_;
  uStack_59c = auVar422._12_2_;
  uStack_59a = auVar422._14_2_;
  auVar174._0_12_ = auVar47._0_12_;
  auVar174._12_2_ = auVar47._6_2_;
  auVar174._14_2_ = uStack_5a2;
  auVar173._12_4_ = auVar174._12_4_;
  auVar173._0_10_ = auVar47._0_10_;
  auVar173._10_2_ = uStack_5a4;
  auVar172._10_6_ = auVar173._10_6_;
  auVar172._0_8_ = auVar47._0_8_;
  auVar172._8_2_ = auVar47._4_2_;
  auVar171._8_8_ = auVar172._8_8_;
  auVar171._6_2_ = uStack_5a6;
  auVar171._4_2_ = auVar47._2_2_;
  auVar171._0_2_ = auVar47._0_2_;
  auVar171._2_2_ = local_5a8;
  auVar279._2_2_ = uStack_5a0;
  auVar279._0_2_ = auVar47._8_2_;
  auVar279._4_2_ = auVar47._10_2_;
  auVar279._6_2_ = uStack_59e;
  auVar279._8_2_ = auVar47._12_2_;
  auVar279._10_2_ = uStack_59c;
  auVar279._12_2_ = auVar47._14_2_;
  auVar279._14_2_ = uStack_59a;
  auVar177 = pmaddwd(auVar171,auVar20);
  auVar47 = pmaddwd(auVar279,auVar20);
  auVar226._0_4_ = auVar177._0_4_ + 0x800 >> 0xc;
  auVar226._4_4_ = auVar177._4_4_ + 0x800 >> 0xc;
  auVar226._8_4_ = auVar177._8_4_ + 0x800 >> 0xc;
  auVar226._12_4_ = auVar177._12_4_ + 0x800 >> 0xc;
  auVar257._0_4_ = auVar47._0_4_ + 0x800 >> 0xc;
  auVar257._4_4_ = auVar47._4_4_ + 0x800 >> 0xc;
  auVar257._8_4_ = auVar47._8_4_ + 0x800 >> 0xc;
  auVar257._12_4_ = auVar47._12_4_ + 0x800 >> 0xc;
  auVar422 = packssdw(auVar226,auVar257);
  auVar47 = pmaddwd(auVar171,auVar21);
  auVar177 = pmaddwd(auVar279,auVar21);
  auVar175._0_4_ = auVar47._0_4_ + 0x800 >> 0xc;
  auVar175._4_4_ = auVar47._4_4_ + 0x800 >> 0xc;
  auVar175._8_4_ = auVar47._8_4_ + 0x800 >> 0xc;
  auVar175._12_4_ = auVar47._12_4_ + 0x800 >> 0xc;
  auVar280._0_4_ = auVar177._0_4_ + 0x800 >> 0xc;
  auVar280._4_4_ = auVar177._4_4_ + 0x800 >> 0xc;
  auVar280._8_4_ = auVar177._8_4_ + 0x800 >> 0xc;
  auVar280._12_4_ = auVar177._12_4_ + 0x800 >> 0xc;
  auVar177 = packssdw(auVar175,auVar280);
  local_6f8 = auVar66._0_2_;
  uStack_6f6 = auVar66._2_2_;
  uStack_6f4 = auVar66._4_2_;
  uStack_6f2 = auVar66._6_2_;
  uStack_6f0 = auVar66._8_2_;
  uStack_6ee = auVar66._10_2_;
  uStack_6ec = auVar66._12_2_;
  uStack_6ea = auVar66._14_2_;
  auVar339._0_12_ = auVar4._0_12_;
  auVar339._12_2_ = auVar4._6_2_;
  auVar339._14_2_ = uStack_6f2;
  auVar338._12_4_ = auVar339._12_4_;
  auVar338._0_10_ = auVar4._0_10_;
  auVar338._10_2_ = uStack_6f4;
  auVar337._10_6_ = auVar338._10_6_;
  auVar337._0_8_ = auVar4._0_8_;
  auVar337._8_2_ = auVar4._4_2_;
  auVar336._8_8_ = auVar337._8_8_;
  auVar336._6_2_ = uStack_6f6;
  auVar336._4_2_ = auVar4._2_2_;
  auVar336._0_2_ = auVar4._0_2_;
  auVar336._2_2_ = local_6f8;
  auVar360._2_2_ = uStack_6f0;
  auVar360._0_2_ = auVar4._8_2_;
  auVar360._4_2_ = auVar4._10_2_;
  auVar360._6_2_ = uStack_6ee;
  auVar360._8_2_ = auVar4._12_2_;
  auVar360._10_2_ = uStack_6ec;
  auVar360._12_2_ = auVar4._14_2_;
  auVar360._14_2_ = uStack_6ea;
  auVar47 = pmaddwd(auVar336,auVar20);
  auVar4 = pmaddwd(auVar360,auVar20);
  auVar281._0_4_ = auVar47._0_4_ + 0x800 >> 0xc;
  auVar281._4_4_ = auVar47._4_4_ + 0x800 >> 0xc;
  auVar281._8_4_ = auVar47._8_4_ + 0x800 >> 0xc;
  auVar281._12_4_ = auVar47._12_4_ + 0x800 >> 0xc;
  auVar354._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar354._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar354._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar354._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar66 = packssdw(auVar281,auVar354);
  auVar4 = pmaddwd(auVar336,auVar21);
  auVar47 = pmaddwd(auVar360,auVar21);
  auVar340._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar340._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar340._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar340._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar361._0_4_ = auVar47._0_4_ + 0x800 >> 0xc;
  auVar361._4_4_ = auVar47._4_4_ + 0x800 >> 0xc;
  auVar361._8_4_ = auVar47._8_4_ + 0x800 >> 0xc;
  auVar361._12_4_ = auVar47._12_4_ + 0x800 >> 0xc;
  auVar295 = packssdw(auVar340,auVar361);
  local_598 = auVar69._0_2_;
  uStack_596 = auVar69._2_2_;
  uStack_594 = auVar69._4_2_;
  uStack_592 = auVar69._6_2_;
  uStack_590 = auVar69._8_2_;
  uStack_58e = auVar69._10_2_;
  uStack_58c = auVar69._12_2_;
  uStack_58a = auVar69._14_2_;
  auVar435._0_12_ = auVar51._0_12_;
  auVar435._12_2_ = auVar51._6_2_;
  auVar435._14_2_ = uStack_592;
  auVar434._12_4_ = auVar435._12_4_;
  auVar434._0_10_ = auVar51._0_10_;
  auVar434._10_2_ = uStack_594;
  auVar433._10_6_ = auVar434._10_6_;
  auVar433._0_8_ = auVar51._0_8_;
  auVar433._8_2_ = auVar51._4_2_;
  auVar432._8_8_ = auVar433._8_8_;
  auVar432._6_2_ = uStack_596;
  auVar432._4_2_ = auVar51._2_2_;
  auVar432._0_2_ = auVar51._0_2_;
  auVar432._2_2_ = local_598;
  auVar377._2_2_ = uStack_590;
  auVar377._0_2_ = auVar51._8_2_;
  auVar377._4_2_ = auVar51._10_2_;
  auVar377._6_2_ = uStack_58e;
  auVar377._8_2_ = auVar51._12_2_;
  auVar377._10_2_ = uStack_58c;
  auVar377._12_2_ = auVar51._14_2_;
  auVar377._14_2_ = uStack_58a;
  auVar47 = pmaddwd(auVar432,auVar20);
  auVar4 = pmaddwd(auVar377,auVar20);
  auVar362._0_4_ = auVar47._0_4_ + 0x800 >> 0xc;
  auVar362._4_4_ = auVar47._4_4_ + 0x800 >> 0xc;
  auVar362._8_4_ = auVar47._8_4_ + 0x800 >> 0xc;
  auVar362._12_4_ = auVar47._12_4_ + 0x800 >> 0xc;
  auVar296._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar296._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar296._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar296._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar51 = packssdw(auVar362,auVar296);
  auVar47 = pmaddwd(auVar432,auVar21);
  auVar4 = pmaddwd(auVar377,auVar21);
  auVar436._0_4_ = auVar47._0_4_ + 0x800 >> 0xc;
  auVar436._4_4_ = auVar47._4_4_ + 0x800 >> 0xc;
  auVar436._8_4_ = auVar47._8_4_ + 0x800 >> 0xc;
  auVar436._12_4_ = auVar47._12_4_ + 0x800 >> 0xc;
  auVar378._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar378._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar378._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar378._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar72 = packssdw(auVar436,auVar378);
  local_6e8 = auVar185._0_2_;
  uStack_6e6 = auVar185._2_2_;
  uStack_6e4 = auVar185._4_2_;
  uStack_6e2 = auVar185._6_2_;
  uStack_6e0 = auVar185._8_2_;
  uStack_6de = auVar185._10_2_;
  uStack_6dc = auVar185._12_2_;
  uStack_6da = auVar185._14_2_;
  auVar382._0_12_ = auVar358._0_12_;
  auVar382._12_2_ = auVar358._6_2_;
  auVar382._14_2_ = uStack_6e2;
  auVar381._12_4_ = auVar382._12_4_;
  auVar381._0_10_ = auVar358._0_10_;
  auVar381._10_2_ = uStack_6e4;
  auVar380._10_6_ = auVar381._10_6_;
  auVar380._0_8_ = auVar358._0_8_;
  auVar380._8_2_ = auVar358._4_2_;
  auVar379._8_8_ = auVar380._8_8_;
  auVar379._6_2_ = uStack_6e6;
  auVar379._4_2_ = auVar358._2_2_;
  auVar379._0_2_ = auVar358._0_2_;
  auVar379._2_2_ = local_6e8;
  auVar414._2_2_ = uStack_6e0;
  auVar414._0_2_ = auVar358._8_2_;
  auVar414._4_2_ = auVar358._10_2_;
  auVar414._6_2_ = uStack_6de;
  auVar414._8_2_ = auVar358._12_2_;
  auVar414._10_2_ = uStack_6dc;
  auVar414._12_2_ = auVar358._14_2_;
  auVar414._14_2_ = uStack_6da;
  auVar4 = pmaddwd(auVar379,auVar20);
  auVar47 = pmaddwd(auVar20,auVar414);
  auVar358 = pmaddwd(auVar379,auVar21);
  auVar327 = pmaddwd(auVar414,auVar21);
  auVar364._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar364._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar364._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar364._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar45._0_4_ = auVar47._0_4_ + 0x800 >> 0xc;
  auVar45._4_4_ = auVar47._4_4_ + 0x800 >> 0xc;
  auVar45._8_4_ = auVar47._8_4_ + 0x800 >> 0xc;
  auVar45._12_4_ = auVar47._12_4_ + 0x800 >> 0xc;
  auVar4 = packssdw(auVar364,auVar45);
  auVar383._0_4_ = auVar358._0_4_ + 0x800 >> 0xc;
  auVar383._4_4_ = auVar358._4_4_ + 0x800 >> 0xc;
  auVar383._8_4_ = auVar358._8_4_ + 0x800 >> 0xc;
  auVar383._12_4_ = auVar358._12_4_ + 0x800 >> 0xc;
  auVar415._0_4_ = auVar327._0_4_ + 0x800 >> 0xc;
  auVar415._4_4_ = auVar327._4_4_ + 0x800 >> 0xc;
  auVar415._8_4_ = auVar327._8_4_ + 0x800 >> 0xc;
  auVar415._12_4_ = auVar327._12_4_ + 0x800 >> 0xc;
  auVar47 = packssdw(auVar383,auVar415);
  alVar416 = (__m128i)paddsw(auVar255,auVar135);
  *output = alVar416;
  alVar416 = (__m128i)psubsw(auVar255,auVar135);
  output[0x3f] = alVar416;
  alVar416 = (__m128i)paddsw(auVar284,auVar181);
  output[1] = alVar416;
  alVar416 = (__m128i)psubsw(auVar284,auVar181);
  output[0x3e] = alVar416;
  alVar416 = (__m128i)paddsw(auVar400,auVar3);
  output[2] = alVar416;
  alVar416 = (__m128i)psubsw(auVar400,auVar3);
  output[0x3d] = alVar416;
  alVar416 = (__m128i)paddsw(auVar410,auVar2);
  output[3] = alVar416;
  alVar416 = (__m128i)psubsw(auVar410,auVar2);
  output[0x3c] = alVar416;
  alVar416 = (__m128i)paddsw(auVar407,auVar49);
  output[4] = alVar416;
  alVar416 = (__m128i)psubsw(auVar407,auVar49);
  output[0x3b] = alVar416;
  alVar416 = (__m128i)paddsw(auVar285,auVar376);
  output[5] = alVar416;
  alVar416 = (__m128i)psubsw(auVar285,auVar376);
  output[0x3a] = alVar416;
  alVar416 = (__m128i)paddsw(auVar35,auVar247);
  output[6] = alVar416;
  alVar416 = (__m128i)psubsw(auVar35,auVar247);
  output[0x39] = alVar416;
  alVar416 = (__m128i)paddsw(auVar36,auVar228);
  output[7] = alVar416;
  alVar416 = (__m128i)psubsw(auVar36,auVar228);
  output[0x38] = alVar416;
  alVar416 = (__m128i)paddsw(auVar141,auVar114);
  output[8] = alVar416;
  alVar416 = (__m128i)psubsw(auVar141,auVar114);
  output[0x37] = alVar416;
  alVar416 = (__m128i)paddsw(auVar132,auVar326);
  output[9] = alVar416;
  alVar416 = (__m128i)psubsw(auVar132,auVar326);
  output[0x36] = alVar416;
  alVar416 = (__m128i)paddsw(auVar213,auVar116);
  output[10] = alVar416;
  alVar416 = (__m128i)psubsw(auVar213,auVar116);
  output[0x35] = alVar416;
  alVar416 = (__m128i)paddsw(auVar215,auVar293);
  output[0xb] = alVar416;
  alVar416 = (__m128i)psubsw(auVar215,auVar293);
  output[0x34] = alVar416;
  alVar416 = (__m128i)paddsw(auVar385,auVar177);
  output[0xc] = alVar416;
  alVar416 = (__m128i)psubsw(auVar385,auVar177);
  output[0x33] = alVar416;
  alVar416 = (__m128i)paddsw(auVar287,auVar295);
  output[0xd] = alVar416;
  alVar416 = (__m128i)psubsw(auVar287,auVar295);
  output[0x32] = alVar416;
  alVar416 = (__m128i)paddsw(auVar286,auVar72);
  output[0xe] = alVar416;
  alVar416 = (__m128i)psubsw(auVar286,auVar72);
  output[0x31] = alVar416;
  alVar416 = (__m128i)paddsw(auVar270,auVar47);
  output[0xf] = alVar416;
  alVar416 = (__m128i)psubsw(auVar270,auVar47);
  output[0x30] = alVar416;
  alVar416 = (__m128i)paddsw(auVar55,auVar4);
  output[0x10] = alVar416;
  alVar416 = (__m128i)psubsw(auVar55,auVar4);
  output[0x2f] = alVar416;
  alVar416 = (__m128i)paddsw(auVar217,auVar51);
  output[0x11] = alVar416;
  alVar416 = (__m128i)psubsw(auVar217,auVar51);
  output[0x2e] = alVar416;
  alVar416 = (__m128i)paddsw(auVar187,auVar66);
  output[0x12] = alVar416;
  alVar416 = (__m128i)psubsw(auVar187,auVar66);
  output[0x2d] = alVar416;
  alVar416 = (__m128i)paddsw(auVar192,auVar422);
  output[0x13] = alVar416;
  alVar416 = (__m128i)psubsw(auVar192,auVar422);
  output[0x2c] = alVar416;
  alVar416 = (__m128i)paddsw(auVar291,auVar74);
  output[0x14] = alVar416;
  alVar416 = (__m128i)psubsw(auVar291,auVar74);
  output[0x2b] = alVar416;
  alVar416 = (__m128i)paddsw(auVar13,auVar288);
  output[0x15] = alVar416;
  alVar416 = (__m128i)psubsw(auVar13,auVar288);
  output[0x2a] = alVar416;
  alVar416 = (__m128i)paddsw(auVar82,auVar103);
  output[0x16] = alVar416;
  alVar416 = (__m128i)psubsw(auVar82,auVar103);
  output[0x29] = alVar416;
  alVar416 = (__m128i)paddsw(auVar191,auVar113);
  output[0x17] = alVar416;
  alVar416 = (__m128i)psubsw(auVar191,auVar113);
  output[0x28] = alVar416;
  alVar416 = (__m128i)paddsw(auVar290,auVar73);
  output[0x18] = alVar416;
  alVar416 = (__m128i)psubsw(auVar290,auVar73);
  output[0x27] = alVar416;
  alVar416 = (__m128i)paddsw(auVar289,auVar184);
  output[0x19] = alVar416;
  alVar416 = (__m128i)psubsw(auVar289,auVar184);
  output[0x26] = alVar416;
  alVar416 = (__m128i)paddsw(auVar188,auVar183);
  output[0x1a] = alVar416;
  alVar416 = (__m128i)psubsw(auVar188,auVar183);
  output[0x25] = alVar416;
  alVar416 = (__m128i)paddsw(auVar258,auVar182);
  output[0x1b] = alVar416;
  alVar416 = (__m128i)psubsw(auVar258,auVar182);
  output[0x24] = alVar416;
  alVar416 = (__m128i)paddsw(auVar231,auVar179);
  output[0x1c] = alVar416;
  alVar416 = (__m128i)psubsw(auVar231,auVar179);
  output[0x23] = alVar416;
  alVar416 = (__m128i)paddsw(auVar401,auVar134);
  output[0x1d] = alVar416;
  alVar416 = (__m128i)psubsw(auVar401,auVar134);
  output[0x22] = alVar416;
  alVar416 = (__m128i)paddsw(auVar71,auVar133);
  output[0x1e] = alVar416;
  alVar416 = (__m128i)psubsw(auVar71,auVar133);
  output[0x21] = alVar416;
  alVar416 = (__m128i)paddsw(auVar7,auVar245);
  output[0x1f] = alVar416;
  alVar416 = (__m128i)psubsw(auVar7,auVar245);
  output[0x20] = alVar416;
  return;
}

Assistant:

static void idct64_low16_ssse3(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);
  const __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  const __m128i cospi_m48_m16 = pair_set_epi16(-cospi[48], -cospi[16]);
  const __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);

  // stage 1
  __m128i x[64];
  x[0] = input[0];
  x[4] = input[8];
  x[8] = input[4];
  x[12] = input[12];
  x[16] = input[2];
  x[20] = input[10];
  x[24] = input[6];
  x[28] = input[14];
  x[32] = input[1];
  x[36] = input[9];
  x[40] = input[5];
  x[44] = input[13];
  x[48] = input[3];
  x[52] = input[11];
  x[56] = input[7];
  x[60] = input[15];

  // stage 2
  btf_16_ssse3(cospi[63], cospi[1], x[32], x[32], x[63]);
  btf_16_ssse3(-cospi[49], cospi[15], x[60], x[35], x[60]);
  btf_16_ssse3(cospi[55], cospi[9], x[36], x[36], x[59]);
  btf_16_ssse3(-cospi[57], cospi[7], x[56], x[39], x[56]);
  btf_16_ssse3(cospi[59], cospi[5], x[40], x[40], x[55]);
  btf_16_ssse3(-cospi[53], cospi[11], x[52], x[43], x[52]);
  btf_16_ssse3(cospi[51], cospi[13], x[44], x[44], x[51]);
  btf_16_ssse3(-cospi[61], cospi[3], x[48], x[47], x[48]);

  // stage 3
  btf_16_ssse3(cospi[62], cospi[2], x[16], x[16], x[31]);
  btf_16_ssse3(-cospi[50], cospi[14], x[28], x[19], x[28]);
  btf_16_ssse3(cospi[54], cospi[10], x[20], x[20], x[27]);
  btf_16_ssse3(-cospi[58], cospi[6], x[24], x[23], x[24]);
  x[33] = x[32];
  x[34] = x[35];
  x[37] = x[36];
  x[38] = x[39];
  x[41] = x[40];
  x[42] = x[43];
  x[45] = x[44];
  x[46] = x[47];
  x[49] = x[48];
  x[50] = x[51];
  x[53] = x[52];
  x[54] = x[55];
  x[57] = x[56];
  x[58] = x[59];
  x[61] = x[60];
  x[62] = x[63];

  // stage 4
  btf_16_ssse3(cospi[60], cospi[4], x[8], x[8], x[15]);
  btf_16_ssse3(-cospi[52], cospi[12], x[12], x[11], x[12]);
  x[17] = x[16];
  x[18] = x[19];
  x[21] = x[20];
  x[22] = x[23];
  x[25] = x[24];
  x[26] = x[27];
  x[29] = x[28];
  x[30] = x[31];
  idct64_stage4_high32_sse2(x, cospi, __rounding, cos_bit);

  // stage 5
  btf_16_ssse3(cospi[56], cospi[8], x[4], x[4], x[7]);
  x[9] = x[8];
  x[10] = x[11];
  x[13] = x[12];
  x[14] = x[15];
  idct64_stage5_high48_sse2(x, cospi, __rounding, cos_bit);

  // stage 6
  btf_16_ssse3(cospi[32], cospi[32], x[0], x[0], x[1]);
  x[5] = x[4];
  x[6] = x[7];
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x[9], x[14], x[9], x[14]);
  btf_16_sse2(cospi_m48_m16, cospi_m16_p48, x[10], x[13], x[10], x[13]);
  idct64_stage6_high48_sse2(x, cospi, __rounding, cos_bit);

  // stage 7
  x[3] = x[0];
  x[2] = x[1];
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[5], x[6], x[5], x[6]);
  btf_16_adds_subs_sse2(x[8], x[11]);
  btf_16_adds_subs_sse2(x[9], x[10]);
  btf_16_subs_adds_sse2(x[15], x[12]);
  btf_16_subs_adds_sse2(x[14], x[13]);
  idct64_stage7_high48_sse2(x, cospi, __rounding, cos_bit);

  // stage 8
  btf_16_adds_subs_sse2(x[0], x[7]);
  btf_16_adds_subs_sse2(x[1], x[6]);
  btf_16_adds_subs_sse2(x[2], x[5]);
  btf_16_adds_subs_sse2(x[3], x[4]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[10], x[13], x[10], x[13]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[11], x[12], x[11], x[12]);
  idct64_stage8_high48_sse2(x, cospi, __rounding, cos_bit);

  idct64_stage9_sse2(x, cospi, __rounding, cos_bit);
  idct64_stage10_sse2(x, cospi, __rounding, cos_bit);
  idct64_stage11_sse2(output, x);
}